

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  float fVar28;
  ulong uVar29;
  undefined8 uVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar79;
  byte bVar80;
  ulong uVar81;
  uint uVar82;
  uint uVar83;
  long lVar84;
  ulong uVar85;
  Geometry *pGVar86;
  long lVar87;
  long lVar88;
  byte bVar89;
  ulong uVar90;
  float fVar91;
  float fVar92;
  float fVar156;
  float fVar158;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar114 [16];
  float fVar162;
  float fVar163;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  vint4 bi_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined4 uVar177;
  float fVar178;
  undefined8 uVar179;
  vint4 bi_1;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  float fVar183;
  float fVar184;
  float fVar192;
  vint4 bi;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar193;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  vint4 ai;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  vint4 ai_1;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  vint4 ai_2;
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  float fVar222;
  float fVar224;
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [16];
  undefined1 (*local_7e8) [32];
  Precalculations *local_7e0;
  ulong local_7d8;
  LinearSpace3fa *local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [64];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  int local_59c;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  float local_540 [4];
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar81 = (ulong)(byte)prim[1];
  lVar87 = uVar81 * 0x25;
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xf + 6)));
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x11 + 6)));
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1a + 6)));
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1b + 6)));
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1c + 6)));
  uVar177 = *(undefined4 *)(prim + lVar87 + 0x12);
  auVar236._4_4_ = uVar177;
  auVar236._0_4_ = uVar177;
  auVar236._8_4_ = uVar177;
  auVar236._12_4_ = uVar177;
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar93 = vsubps_avx512vl(auVar106,*(undefined1 (*) [16])(prim + lVar87 + 6));
  fVar184 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar87 + 0x16)) *
            *(float *)(prim + lVar87 + 0x1a);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar112 = vpmovsxwd_avx(auVar106);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar81 * 0xb + 6);
  auVar239 = vpmovsxwd_avx(auVar109);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar113 = vpmovsxwd_avx(auVar108);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar81 * 0xd + 6);
  auVar114 = vpmovsxwd_avx(auVar107);
  auVar94 = vpbroadcastd_avx512vl();
  auVar106 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar106 = vinsertps_avx512f(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar93 = vmulps_avx512vl(auVar236,auVar93);
  auVar95 = vmulps_avx512vl(auVar236,auVar106);
  auVar96 = vcvtdq2ps_avx512vl(auVar27);
  auVar97 = vcvtdq2ps_avx512vl(auVar102);
  auVar98 = vcvtdq2ps_avx512vl(auVar98);
  auVar99 = vcvtdq2ps_avx512vl(auVar99);
  auVar100 = vcvtdq2ps_avx512vl(auVar100);
  auVar106 = vcvtdq2ps_avx(auVar101);
  auVar109 = vcvtdq2ps_avx(auVar103);
  auVar108 = vcvtdq2ps_avx(auVar104);
  auVar107 = vcvtdq2ps_avx(auVar105);
  uVar177 = auVar95._0_4_;
  auVar227._4_4_ = uVar177;
  auVar227._0_4_ = uVar177;
  auVar227._8_4_ = uVar177;
  auVar227._12_4_ = uVar177;
  auVar27 = vshufps_avx(auVar95,auVar95,0x55);
  auVar102 = vshufps_avx(auVar95,auVar95,0xaa);
  auVar101 = vmulps_avx512vl(auVar102,auVar98);
  auVar180._0_4_ = auVar102._0_4_ * auVar106._0_4_;
  auVar180._4_4_ = auVar102._4_4_ * auVar106._4_4_;
  auVar180._8_4_ = auVar102._8_4_ * auVar106._8_4_;
  auVar180._12_4_ = auVar102._12_4_ * auVar106._12_4_;
  auVar95._0_4_ = auVar107._0_4_ * auVar102._0_4_;
  auVar95._4_4_ = auVar107._4_4_ * auVar102._4_4_;
  auVar95._8_4_ = auVar107._8_4_ * auVar102._8_4_;
  auVar95._12_4_ = auVar107._12_4_ * auVar102._12_4_;
  auVar102 = vfmadd231ps_avx512vl(auVar101,auVar27,auVar97);
  auVar101 = vfmadd231ps_avx512vl(auVar180,auVar27,auVar100);
  auVar27 = vfmadd231ps_fma(auVar95,auVar108,auVar27);
  auVar102 = vfmadd231ps_avx512vl(auVar102,auVar227,auVar96);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar227,auVar99);
  auVar27 = vfmadd231ps_fma(auVar27,auVar109,auVar227);
  auVar103 = vbroadcastss_avx512vl(auVar93);
  auVar104 = vshufps_avx512vl(auVar93,auVar93,0x55);
  auVar105 = vshufps_avx512vl(auVar93,auVar93,0xaa);
  auVar98 = vmulps_avx512vl(auVar105,auVar98);
  auVar106 = vmulps_avx512vl(auVar105,auVar106);
  auVar107 = vmulps_avx512vl(auVar105,auVar107);
  auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,auVar97);
  auVar106 = vfmadd231ps_avx512vl(auVar106,auVar104,auVar100);
  auVar108 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar108);
  auVar96 = vfmadd231ps_avx512vl(auVar98,auVar103,auVar96);
  auVar97 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar99);
  auVar95 = vfmadd231ps_fma(auVar108,auVar103,auVar109);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar240 = ZEXT1664(auVar106);
  auVar109 = vandps_avx512vl(auVar102,auVar106);
  auVar232._8_4_ = 0x219392ef;
  auVar232._0_8_ = 0x219392ef219392ef;
  auVar232._12_4_ = 0x219392ef;
  uVar85 = vcmpps_avx512vl(auVar109,auVar232,1);
  bVar13 = (bool)((byte)uVar85 & 1);
  auVar93._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._0_4_;
  bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._4_4_;
  bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._8_4_;
  bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._12_4_;
  auVar109 = vandps_avx512vl(auVar101,auVar106);
  uVar85 = vcmpps_avx512vl(auVar109,auVar232,1);
  bVar13 = (bool)((byte)uVar85 & 1);
  auVar110._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar101._0_4_;
  bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar101._4_4_;
  bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar101._8_4_;
  bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar101._12_4_;
  auVar106 = vandps_avx512vl(auVar27,auVar106);
  uVar85 = vcmpps_avx512vl(auVar106,auVar232,1);
  bVar13 = (bool)((byte)uVar85 & 1);
  auVar111._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar27._0_4_;
  bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar27._4_4_;
  bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar27._8_4_;
  bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar27._12_4_;
  auVar109 = vrcp14ps_avx512vl(auVar93);
  auVar233._8_4_ = 0x3f800000;
  auVar233._0_8_ = 0x3f8000003f800000;
  auVar233._12_4_ = 0x3f800000;
  auVar106 = vfnmadd213ps_fma(auVar93,auVar109,auVar233);
  auVar107 = vfmadd132ps_fma(auVar106,auVar109,auVar109);
  auVar109 = vrcp14ps_avx512vl(auVar110);
  auVar106 = vfnmadd213ps_fma(auVar110,auVar109,auVar233);
  auVar105 = vfmadd132ps_fma(auVar106,auVar109,auVar109);
  auVar109 = vrcp14ps_avx512vl(auVar111);
  auVar106 = vfnmadd213ps_fma(auVar111,auVar109,auVar233);
  auVar93 = vfmadd132ps_fma(auVar106,auVar109,auVar109);
  auVar206._4_4_ = fVar184;
  auVar206._0_4_ = fVar184;
  auVar206._8_4_ = fVar184;
  auVar206._12_4_ = fVar184;
  auVar106 = vcvtdq2ps_avx(auVar112);
  auVar109 = vcvtdq2ps_avx(auVar239);
  auVar109 = vsubps_avx(auVar109,auVar106);
  auVar112 = vfmadd213ps_fma(auVar109,auVar206,auVar106);
  auVar106 = vcvtdq2ps_avx(auVar113);
  auVar109 = vcvtdq2ps_avx(auVar114);
  auVar109 = vsubps_avx(auVar109,auVar106);
  auVar239 = vfmadd213ps_fma(auVar109,auVar206,auVar106);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar81 * 0x12 + 6);
  auVar106 = vpmovsxwd_avx(auVar27);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar81 * 0x16 + 6);
  auVar109 = vpmovsxwd_avx(auVar102);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar108 = vsubps_avx(auVar109,auVar106);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar81 * 0x14 + 6);
  auVar109 = vpmovsxwd_avx(auVar98);
  auVar108 = vfmadd213ps_fma(auVar108,auVar206,auVar106);
  auVar106 = vcvtdq2ps_avx(auVar109);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar81 * 0x18 + 6);
  auVar109 = vpmovsxwd_avx(auVar99);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,auVar106);
  auVar27 = vfmadd213ps_fma(auVar109,auVar206,auVar106);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar81 * 0x1d + 6);
  auVar106 = vpmovsxwd_avx(auVar100);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar81 * 0x21 + 6);
  auVar109 = vpmovsxwd_avx(auVar101);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,auVar106);
  auVar102 = vfmadd213ps_fma(auVar109,auVar206,auVar106);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar81 * 0x1f + 6);
  auVar106 = vpmovsxwd_avx(auVar103);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar81 * 0x23 + 6);
  auVar109 = vpmovsxwd_avx(auVar104);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,auVar106);
  auVar109 = vfmadd213ps_fma(auVar109,auVar206,auVar106);
  auVar106 = vsubps_avx(auVar112,auVar96);
  auVar207._0_4_ = auVar107._0_4_ * auVar106._0_4_;
  auVar207._4_4_ = auVar107._4_4_ * auVar106._4_4_;
  auVar207._8_4_ = auVar107._8_4_ * auVar106._8_4_;
  auVar207._12_4_ = auVar107._12_4_ * auVar106._12_4_;
  auVar106 = vsubps_avx(auVar239,auVar96);
  auVar185._0_4_ = auVar107._0_4_ * auVar106._0_4_;
  auVar185._4_4_ = auVar107._4_4_ * auVar106._4_4_;
  auVar185._8_4_ = auVar107._8_4_ * auVar106._8_4_;
  auVar185._12_4_ = auVar107._12_4_ * auVar106._12_4_;
  auVar106 = vsubps_avx(auVar108,auVar97);
  auVar213._0_4_ = auVar105._0_4_ * auVar106._0_4_;
  auVar213._4_4_ = auVar105._4_4_ * auVar106._4_4_;
  auVar213._8_4_ = auVar105._8_4_ * auVar106._8_4_;
  auVar213._12_4_ = auVar105._12_4_ * auVar106._12_4_;
  auVar106 = vsubps_avx(auVar27,auVar97);
  auVar96._0_4_ = auVar105._0_4_ * auVar106._0_4_;
  auVar96._4_4_ = auVar105._4_4_ * auVar106._4_4_;
  auVar96._8_4_ = auVar105._8_4_ * auVar106._8_4_;
  auVar96._12_4_ = auVar105._12_4_ * auVar106._12_4_;
  auVar106 = vsubps_avx(auVar102,auVar95);
  auVar97._0_4_ = auVar93._0_4_ * auVar106._0_4_;
  auVar97._4_4_ = auVar93._4_4_ * auVar106._4_4_;
  auVar97._8_4_ = auVar93._8_4_ * auVar106._8_4_;
  auVar97._12_4_ = auVar93._12_4_ * auVar106._12_4_;
  auVar106 = vsubps_avx(auVar109,auVar95);
  auVar114._0_4_ = auVar93._0_4_ * auVar106._0_4_;
  auVar114._4_4_ = auVar93._4_4_ * auVar106._4_4_;
  auVar114._8_4_ = auVar93._8_4_ * auVar106._8_4_;
  auVar114._12_4_ = auVar93._12_4_ * auVar106._12_4_;
  auVar106 = vpminsd_avx(auVar207,auVar185);
  auVar109 = vpminsd_avx(auVar213,auVar96);
  auVar106 = vmaxps_avx(auVar106,auVar109);
  auVar109 = vpminsd_avx(auVar97,auVar114);
  uVar177 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar105._4_4_ = uVar177;
  auVar105._0_4_ = uVar177;
  auVar105._8_4_ = uVar177;
  auVar105._12_4_ = uVar177;
  auVar109 = vmaxps_avx512vl(auVar109,auVar105);
  auVar106 = vmaxps_avx(auVar106,auVar109);
  auVar112._8_4_ = 0x3f7ffffa;
  auVar112._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar112._12_4_ = 0x3f7ffffa;
  local_4d0 = vmulps_avx512vl(auVar106,auVar112);
  auVar106 = vpmaxsd_avx(auVar207,auVar185);
  auVar109 = vpmaxsd_avx(auVar213,auVar96);
  auVar106 = vminps_avx(auVar106,auVar109);
  auVar109 = vpmaxsd_avx(auVar97,auVar114);
  uVar177 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar239._4_4_ = uVar177;
  auVar239._0_4_ = uVar177;
  auVar239._8_4_ = uVar177;
  auVar239._12_4_ = uVar177;
  auVar109 = vminps_avx512vl(auVar109,auVar239);
  auVar106 = vminps_avx(auVar106,auVar109);
  auVar113._8_4_ = 0x3f800003;
  auVar113._0_8_ = 0x3f8000033f800003;
  auVar113._12_4_ = 0x3f800003;
  auVar106 = vmulps_avx512vl(auVar106,auVar113);
  uVar179 = vcmpps_avx512vl(local_4d0,auVar106,2);
  uVar30 = vpcmpgtd_avx512vl(auVar94,_DAT_01f4ad30);
  local_7c8 = (ulong)((byte)uVar179 & 0xf & (byte)uVar30);
  local_7d0 = pre->ray_space + k;
  local_7e8 = (undefined1 (*) [32])local_100;
  auVar176 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar176);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar176 = ZEXT1664(auVar106);
  local_7e0 = pre;
  do {
    auVar125 = local_7a0;
    if (local_7c8 == 0) {
      return;
    }
    lVar87 = 0;
    for (uVar85 = local_7c8; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
      lVar87 = lVar87 + 1;
    }
    uVar6 = *(uint *)(prim + 2);
    uVar83 = *(uint *)(prim + lVar87 * 4 + 6);
    uVar85 = (ulong)uVar83;
    pGVar86 = (context->scene->geometries).items[uVar6].ptr;
    uVar81 = (ulong)*(uint *)(*(long *)&pGVar86->field_0x58 +
                             uVar85 * pGVar86[1].super_RefCount.refCounter.
                                      super___atomic_base<unsigned_long>._M_i);
    fVar184 = (pGVar86->time_range).lower;
    fVar184 = pGVar86->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x1c0) - fVar184) / ((pGVar86->time_range).upper - fVar184)
              );
    auVar106 = vroundss_avx(ZEXT416((uint)fVar184),ZEXT416((uint)fVar184),9);
    auVar106 = vminss_avx(auVar106,ZEXT416((uint)(pGVar86->fnumTimeSegments + -1.0)));
    auVar106 = vmaxss_avx(ZEXT816(0) << 0x20,auVar106);
    fVar184 = fVar184 - auVar106._0_4_;
    fVar28 = 1.0 - fVar184;
    _Var9 = pGVar86[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar88 = (long)(int)auVar106._0_4_ * 0x38;
    lVar84 = *(long *)(_Var9 + 0x10 + lVar88);
    lVar10 = *(long *)(_Var9 + 0x38 + lVar88);
    lVar11 = *(long *)(_Var9 + 0x48 + lVar88);
    auVar94._4_4_ = fVar184;
    auVar94._0_4_ = fVar184;
    auVar94._8_4_ = fVar184;
    auVar94._12_4_ = fVar184;
    pfVar3 = (float *)(lVar10 + lVar11 * uVar81);
    auVar229._0_4_ = fVar184 * *pfVar3;
    auVar229._4_4_ = fVar184 * pfVar3[1];
    auVar229._8_4_ = fVar184 * pfVar3[2];
    auVar229._12_4_ = fVar184 * pfVar3[3];
    lVar87 = uVar81 + 1;
    auVar106 = vmulps_avx512vl(auVar94,*(undefined1 (*) [16])(lVar10 + lVar11 * lVar87));
    p_Var12 = pGVar86[4].occlusionFilterN;
    auVar181._4_4_ = fVar28;
    auVar181._0_4_ = fVar28;
    auVar181._8_4_ = fVar28;
    auVar181._12_4_ = fVar28;
    auVar107 = vfmadd231ps_fma(auVar229,auVar181,
                               *(undefined1 (*) [16])(*(long *)(_Var9 + lVar88) + lVar84 * uVar81));
    auVar103 = vfmadd231ps_avx512vl
                         (auVar106,auVar181,
                          *(undefined1 (*) [16])(*(long *)(_Var9 + lVar88) + lVar84 * lVar87));
    pfVar3 = (float *)(*(long *)(p_Var12 + lVar88 + 0x38) +
                      uVar81 * *(long *)(p_Var12 + lVar88 + 0x48));
    auVar234._0_4_ = fVar184 * *pfVar3;
    auVar234._4_4_ = fVar184 * pfVar3[1];
    auVar234._8_4_ = fVar184 * pfVar3[2];
    auVar234._12_4_ = fVar184 * pfVar3[3];
    pfVar3 = (float *)(*(long *)(p_Var12 + lVar88 + 0x38) +
                      *(long *)(p_Var12 + lVar88 + 0x48) * lVar87);
    auVar235._0_4_ = fVar184 * *pfVar3;
    auVar235._4_4_ = fVar184 * pfVar3[1];
    auVar235._8_4_ = fVar184 * pfVar3[2];
    auVar235._12_4_ = fVar184 * pfVar3[3];
    auVar109 = vfmadd231ps_fma(auVar234,auVar181,
                               *(undefined1 (*) [16])
                                (*(long *)(p_Var12 + lVar88) +
                                *(long *)(p_Var12 + lVar88 + 0x10) * uVar81));
    auVar108 = vfmadd231ps_fma(auVar235,auVar181,
                               *(undefined1 (*) [16])
                                (*(long *)(p_Var12 + lVar88) +
                                *(long *)(p_Var12 + lVar88 + 0x10) * lVar87));
    auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                             0x1c);
    iVar7 = (int)pGVar86[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar113 = auVar176._0_16_;
    auVar104 = vfnmadd213ps_avx512vl(auVar109,auVar113,auVar107);
    auVar105 = vfmadd213ps_avx512vl(auVar108,auVar113,auVar103);
    auVar108 = vsubps_avx(auVar107,auVar106);
    uVar177 = auVar108._0_4_;
    auVar194._4_4_ = uVar177;
    auVar194._0_4_ = uVar177;
    auVar194._8_4_ = uVar177;
    auVar194._12_4_ = uVar177;
    auVar109 = vshufps_avx(auVar108,auVar108,0x55);
    aVar4 = (local_7d0->vx).field_0;
    aVar5 = (local_7d0->vy).field_0;
    auVar108 = vshufps_avx(auVar108,auVar108,0xaa);
    fVar184 = (local_7d0->vz).field_0.m128[0];
    fVar28 = *(float *)((long)&(local_7d0->vz).field_0 + 4);
    fVar62 = *(float *)((long)&(local_7d0->vz).field_0 + 8);
    fVar63 = *(float *)((long)&(local_7d0->vz).field_0 + 0xc);
    auVar223._0_4_ = fVar184 * auVar108._0_4_;
    auVar223._4_4_ = fVar28 * auVar108._4_4_;
    auVar223._8_4_ = fVar62 * auVar108._8_4_;
    auVar223._12_4_ = fVar63 * auVar108._12_4_;
    auVar109 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar5,auVar109);
    auVar27 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar4,auVar194);
    auVar108 = vsubps_avx(auVar104,auVar106);
    uVar177 = auVar108._0_4_;
    auVar195._4_4_ = uVar177;
    auVar195._0_4_ = uVar177;
    auVar195._8_4_ = uVar177;
    auVar195._12_4_ = uVar177;
    auVar109 = vshufps_avx(auVar108,auVar108,0x55);
    auVar108 = vshufps_avx(auVar108,auVar108,0xaa);
    auVar225._0_4_ = fVar184 * auVar108._0_4_;
    auVar225._4_4_ = fVar28 * auVar108._4_4_;
    auVar225._8_4_ = fVar62 * auVar108._8_4_;
    auVar225._12_4_ = fVar63 * auVar108._12_4_;
    auVar109 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar5,auVar109);
    auVar102 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar4,auVar195);
    auVar108 = vsubps_avx(auVar105,auVar106);
    uVar177 = auVar108._0_4_;
    auVar196._4_4_ = uVar177;
    auVar196._0_4_ = uVar177;
    auVar196._8_4_ = uVar177;
    auVar196._12_4_ = uVar177;
    auVar109 = vshufps_avx(auVar108,auVar108,0x55);
    auVar108 = vshufps_avx(auVar108,auVar108,0xaa);
    auVar228._0_4_ = fVar184 * auVar108._0_4_;
    auVar228._4_4_ = fVar28 * auVar108._4_4_;
    auVar228._8_4_ = fVar62 * auVar108._8_4_;
    auVar228._12_4_ = fVar63 * auVar108._12_4_;
    auVar109 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar5,auVar109);
    auVar108 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar4,auVar196);
    auVar109 = vsubps_avx512vl(auVar103,auVar106);
    uVar177 = auVar109._0_4_;
    auVar197._4_4_ = uVar177;
    auVar197._0_4_ = uVar177;
    auVar197._8_4_ = uVar177;
    auVar197._12_4_ = uVar177;
    auVar106 = vshufps_avx(auVar109,auVar109,0x55);
    auVar109 = vshufps_avx(auVar109,auVar109,0xaa);
    auVar231._0_4_ = fVar184 * auVar109._0_4_;
    auVar231._4_4_ = fVar28 * auVar109._4_4_;
    auVar231._8_4_ = fVar62 * auVar109._8_4_;
    auVar231._12_4_ = fVar63 * auVar109._12_4_;
    auVar106 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar5,auVar106);
    lVar87 = (long)iVar7 * 0x44;
    auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar87);
    auVar98 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar4,auVar197);
    uVar177 = auVar27._0_4_;
    local_620._4_4_ = uVar177;
    local_620._0_4_ = uVar177;
    local_620._8_4_ = uVar177;
    local_620._12_4_ = uVar177;
    local_620._16_4_ = uVar177;
    local_620._20_4_ = uVar177;
    local_620._24_4_ = uVar177;
    local_620._28_4_ = uVar177;
    auVar115._8_4_ = 1;
    auVar115._0_8_ = 0x100000001;
    auVar115._12_4_ = 1;
    auVar115._16_4_ = 1;
    auVar115._20_4_ = 1;
    auVar115._24_4_ = 1;
    auVar115._28_4_ = 1;
    local_640 = vpermps_avx2(auVar115,ZEXT1632(auVar27));
    auVar131 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0x484);
    uVar177 = auVar102._0_4_;
    auVar198._4_4_ = uVar177;
    auVar198._0_4_ = uVar177;
    auVar198._8_4_ = uVar177;
    auVar198._12_4_ = uVar177;
    local_660._16_4_ = uVar177;
    local_660._0_16_ = auVar198;
    local_660._20_4_ = uVar177;
    local_660._24_4_ = uVar177;
    local_660._28_4_ = uVar177;
    local_680 = vpermps_avx512vl(auVar115,ZEXT1632(auVar102));
    auVar129 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0x908);
    local_6a0 = vbroadcastss_avx512vl(auVar108);
    auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0xd8c);
    local_6c0 = vpermps_avx512vl(auVar115,ZEXT1632(auVar108));
    uVar177 = auVar98._0_4_;
    local_6e0._4_4_ = uVar177;
    local_6e0._0_4_ = uVar177;
    fStack_6d8 = (float)uVar177;
    fStack_6d4 = (float)uVar177;
    fStack_6d0 = (float)uVar177;
    fStack_6cc = (float)uVar177;
    fStack_6c8 = (float)uVar177;
    register0x0000139c = uVar177;
    _local_700 = vpermps_avx512vl(auVar115,ZEXT1632(auVar98));
    auVar115 = vmulps_avx512vl(_local_6e0,auVar128);
    auVar116 = vmulps_avx512vl(_local_700,auVar128);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar129,local_6a0);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar129,local_6c0);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar131,local_660);
    auVar117 = vfmadd231ps_avx512vl(auVar116,auVar131,local_680);
    auVar118 = vfmadd231ps_avx512vl(auVar115,auVar127,local_620);
    auVar218 = ZEXT3264(auVar118);
    auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar87);
    auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0x484);
    auVar130 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0x908);
    auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0xd8c);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar127,local_640);
    auVar212 = ZEXT3264(auVar117);
    auVar119 = vmulps_avx512vl(_local_6e0,auVar126);
    auVar120 = vmulps_avx512vl(_local_700,auVar126);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar130,local_6a0);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar130,local_6c0);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,local_660);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,local_680);
    auVar99 = vfmadd231ps_fma(auVar119,auVar115,local_620);
    auVar220 = ZEXT1664(auVar99);
    auVar100 = vfmadd231ps_fma(auVar120,auVar115,local_640);
    auVar119 = vsubps_avx512vl(ZEXT1632(auVar99),auVar118);
    auVar120 = vsubps_avx512vl(ZEXT1632(auVar100),auVar117);
    auVar121 = vmulps_avx512vl(auVar117,auVar119);
    auVar122 = vmulps_avx512vl(auVar118,auVar120);
    auVar121 = vsubps_avx512vl(auVar121,auVar122);
    auVar106 = vshufps_avx(auVar107,auVar107,0xff);
    uVar179 = auVar106._0_8_;
    local_3a0._8_8_ = uVar179;
    local_3a0._0_8_ = uVar179;
    local_3a0._16_8_ = uVar179;
    local_3a0._24_8_ = uVar179;
    auVar106 = vshufps_avx(auVar104,auVar104,0xff);
    local_3c0 = vbroadcastsd_avx512vl(auVar106);
    auVar106 = vshufps_avx(auVar105,auVar105,0xff);
    local_3e0 = vbroadcastsd_avx512vl(auVar106);
    auVar106 = vshufps_avx512vl(auVar103,auVar103,0xff);
    uVar179 = auVar106._0_8_;
    local_400._8_8_ = uVar179;
    local_400._0_8_ = uVar179;
    local_400._16_8_ = uVar179;
    local_400._24_8_ = uVar179;
    auVar122 = vmulps_avx512vl(local_400,auVar128);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar129,local_3e0);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar131,local_3c0);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar127,local_3a0);
    auVar123 = vmulps_avx512vl(local_400,auVar126);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar130,local_3e0);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar116,local_3c0);
    auVar101 = vfmadd231ps_fma(auVar123,auVar115,local_3a0);
    auVar123 = vmulps_avx512vl(auVar120,auVar120);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar119,auVar119);
    auVar124 = vmaxps_avx512vl(auVar122,ZEXT1632(auVar101));
    auVar124 = vmulps_avx512vl(auVar124,auVar124);
    auVar123 = vmulps_avx512vl(auVar124,auVar123);
    auVar121 = vmulps_avx512vl(auVar121,auVar121);
    uVar179 = vcmpps_avx512vl(auVar121,auVar123,2);
    auVar106 = vblendps_avx(auVar27,auVar107,8);
    auVar239 = auVar240._0_16_;
    auVar109 = vandps_avx512vl(auVar106,auVar239);
    auVar106 = vblendps_avx(auVar102,auVar104,8);
    auVar106 = vandps_avx512vl(auVar106,auVar239);
    auVar109 = vmaxps_avx(auVar109,auVar106);
    auVar106 = vblendps_avx(auVar108,auVar105,8);
    auVar112 = vandps_avx512vl(auVar106,auVar239);
    auVar106 = vblendps_avx(auVar98,auVar103,8);
    auVar106 = vandps_avx512vl(auVar106,auVar239);
    auVar106 = vmaxps_avx(auVar112,auVar106);
    auVar106 = vmaxps_avx(auVar109,auVar106);
    auVar109 = vmovshdup_avx(auVar106);
    auVar109 = vmaxss_avx(auVar109,auVar106);
    auVar106 = vshufpd_avx(auVar106,auVar106,1);
    auVar106 = vmaxss_avx(auVar106,auVar109);
    auVar121._0_4_ = (float)iVar7;
    local_7a0._4_12_ = auVar105._4_12_;
    local_7a0._0_4_ = auVar121._0_4_;
    local_7a0._16_16_ = auVar125._16_16_;
    auVar121._4_4_ = auVar121._0_4_;
    auVar121._8_4_ = auVar121._0_4_;
    auVar121._12_4_ = auVar121._0_4_;
    auVar121._16_4_ = auVar121._0_4_;
    auVar121._20_4_ = auVar121._0_4_;
    auVar121._24_4_ = auVar121._0_4_;
    auVar121._28_4_ = auVar121._0_4_;
    uVar30 = vcmpps_avx512vl(auVar121,_DAT_01f7b060,0xe);
    bVar89 = (byte)uVar179 & (byte)uVar30;
    fVar184 = auVar106._0_4_ * 4.7683716e-07;
    local_800 = ZEXT416((uint)fVar184);
    auVar125._8_4_ = 2;
    auVar125._0_8_ = 0x200000002;
    auVar125._12_4_ = 2;
    auVar125._16_4_ = 2;
    auVar125._20_4_ = 2;
    auVar125._24_4_ = 2;
    auVar125._28_4_ = 2;
    local_460 = vpermps_avx2(auVar125,ZEXT1632(auVar27));
    local_480 = vpermps_avx2(auVar125,ZEXT1632(auVar102));
    local_4a0 = vpermps_avx2(auVar125,ZEXT1632(auVar108));
    local_4c0 = vpermps_avx2(auVar125,ZEXT1632(auVar98));
    local_760 = *(undefined4 *)(ray + k * 4 + 0xc0);
    uStack_75c = 0;
    uStack_758 = 0;
    uStack_754 = 0;
    auVar155 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar155);
    auVar155 = vpbroadcastd_avx512f();
    local_340 = vmovdqa64_avx512f(auVar155);
    local_840 = auVar107._0_8_;
    uStack_838 = auVar107._8_8_;
    local_860 = auVar104._0_8_;
    uStack_858 = auVar104._8_8_;
    local_870 = auVar105._0_8_;
    uStack_868 = auVar105._8_8_;
    local_850._0_4_ = auVar103._0_4_;
    fVar28 = (float)local_850;
    local_850._4_4_ = auVar103._4_4_;
    fVar62 = local_850._4_4_;
    uStack_848._0_4_ = auVar103._8_4_;
    fVar63 = (float)uStack_848;
    uStack_848._4_4_ = auVar103._12_4_;
    fVar79 = uStack_848._4_4_;
    local_850 = auVar103._0_8_;
    uStack_848 = auVar103._8_8_;
    if (bVar89 != 0) {
      auVar125 = vmulps_avx512vl(local_4c0,auVar126);
      auVar125 = vfmadd213ps_avx512vl(auVar130,local_4a0,auVar125);
      auVar125 = vfmadd213ps_avx512vl(auVar116,local_480,auVar125);
      auVar115 = vfmadd213ps_avx512vl(auVar115,local_460,auVar125);
      auVar125 = vmulps_avx512vl(local_4c0,auVar128);
      auVar125 = vfmadd213ps_avx512vl(auVar129,local_4a0,auVar125);
      auVar116 = vfmadd213ps_avx512vl(auVar131,local_480,auVar125);
      auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0x1210);
      auVar131 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0x1694);
      auVar129 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0x1b18);
      auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0x1f9c);
      auVar126 = vfmadd213ps_avx512vl(auVar127,local_460,auVar116);
      auVar127 = vmulps_avx512vl(_local_6e0,auVar128);
      auVar116 = vmulps_avx512vl(_local_700,auVar128);
      auVar128 = vmulps_avx512vl(local_4c0,auVar128);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar129,local_6a0);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar129,local_6c0);
      auVar129 = vfmadd231ps_avx512vl(auVar128,local_4a0,auVar129);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar131,local_660);
      auVar128 = vfmadd231ps_avx512vl(auVar116,auVar131,local_680);
      auVar116 = vfmadd231ps_avx512vl(auVar129,local_480,auVar131);
      auVar106 = vfmadd231ps_fma(auVar127,auVar125,local_620);
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar125,local_640);
      auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0x1210);
      auVar131 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0x1b18);
      auVar129 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0x1f9c);
      auVar116 = vfmadd231ps_avx512vl(auVar116,local_460,auVar125);
      auVar125 = vmulps_avx512vl(_local_6e0,auVar129);
      auVar130 = vmulps_avx512vl(_local_700,auVar129);
      auVar129 = vmulps_avx512vl(local_4c0,auVar129);
      auVar123 = vfmadd231ps_avx512vl(auVar125,auVar131,local_6a0);
      auVar130 = vfmadd231ps_avx512vl(auVar130,auVar131,local_6c0);
      auVar131 = vfmadd231ps_avx512vl(auVar129,local_4a0,auVar131);
      auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0x1694);
      auVar129 = vfmadd231ps_avx512vl(auVar123,auVar125,local_660);
      auVar130 = vfmadd231ps_avx512vl(auVar130,auVar125,local_680);
      auVar125 = vfmadd231ps_avx512vl(auVar131,local_480,auVar125);
      auVar109 = vfmadd231ps_fma(auVar129,auVar127,local_620);
      auVar131 = vfmadd231ps_avx512vl(auVar130,auVar127,local_640);
      auVar129 = vfmadd231ps_avx512vl(auVar125,local_460,auVar127);
      auVar176 = ZEXT1664(auVar113);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar240 = ZEXT1664(auVar108);
      auVar237._8_4_ = 0x7fffffff;
      auVar237._0_8_ = 0x7fffffff7fffffff;
      auVar237._12_4_ = 0x7fffffff;
      auVar237._16_4_ = 0x7fffffff;
      auVar237._20_4_ = 0x7fffffff;
      auVar237._24_4_ = 0x7fffffff;
      auVar237._28_4_ = 0x7fffffff;
      auVar125 = vandps_avx(ZEXT1632(auVar106),auVar237);
      auVar127 = vandps_avx(auVar128,auVar237);
      auVar127 = vmaxps_avx(auVar125,auVar127);
      auVar125 = vandps_avx(auVar116,auVar237);
      auVar125 = vmaxps_avx(auVar127,auVar125);
      auVar230._4_4_ = fVar184;
      auVar230._0_4_ = fVar184;
      auVar230._8_4_ = fVar184;
      auVar230._12_4_ = fVar184;
      auVar230._16_4_ = fVar184;
      auVar230._20_4_ = fVar184;
      auVar230._24_4_ = fVar184;
      auVar230._28_4_ = fVar184;
      uVar81 = vcmpps_avx512vl(auVar125,auVar230,1);
      bVar13 = (bool)((byte)uVar81 & 1);
      auVar123._0_4_ = (float)((uint)bVar13 * auVar119._0_4_ | (uint)!bVar13 * auVar106._0_4_);
      bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar123._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar106._4_4_);
      bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar123._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar106._8_4_);
      bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar123._12_4_ = (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar106._12_4_);
      fVar224 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar119._16_4_);
      auVar123._16_4_ = fVar224;
      fVar222 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar119._20_4_);
      auVar123._20_4_ = fVar222;
      fVar178 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar119._24_4_);
      auVar123._24_4_ = fVar178;
      uVar82 = (uint)(byte)(uVar81 >> 7) * auVar119._28_4_;
      auVar123._28_4_ = uVar82;
      bVar13 = (bool)((byte)uVar81 & 1);
      auVar124._0_4_ = (float)((uint)bVar13 * auVar120._0_4_ | (uint)!bVar13 * auVar128._0_4_);
      bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar124._4_4_ = (float)((uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * auVar128._4_4_);
      bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar124._8_4_ = (float)((uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * auVar128._8_4_);
      bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar124._12_4_ = (float)((uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * auVar128._12_4_);
      bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar124._16_4_ = (float)((uint)bVar13 * auVar120._16_4_ | (uint)!bVar13 * auVar128._16_4_);
      bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar124._20_4_ = (float)((uint)bVar13 * auVar120._20_4_ | (uint)!bVar13 * auVar128._20_4_);
      bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar124._24_4_ = (float)((uint)bVar13 * auVar120._24_4_ | (uint)!bVar13 * auVar128._24_4_);
      bVar13 = SUB81(uVar81 >> 7,0);
      auVar124._28_4_ = (uint)bVar13 * auVar120._28_4_ | (uint)!bVar13 * auVar128._28_4_;
      auVar125 = vandps_avx(auVar237,ZEXT1632(auVar109));
      auVar127 = vandps_avx(auVar131,auVar237);
      auVar127 = vmaxps_avx(auVar125,auVar127);
      auVar125 = vandps_avx(auVar129,auVar237);
      auVar125 = vmaxps_avx(auVar127,auVar125);
      uVar81 = vcmpps_avx512vl(auVar125,auVar230,1);
      bVar13 = (bool)((byte)uVar81 & 1);
      auVar132._0_4_ = (float)((uint)bVar13 * auVar119._0_4_ | (uint)!bVar13 * auVar109._0_4_);
      bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar132._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar109._4_4_);
      bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar132._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar109._8_4_);
      bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar132._12_4_ = (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar109._12_4_);
      fVar193 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar119._16_4_);
      auVar132._16_4_ = fVar193;
      fVar183 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar119._20_4_);
      auVar132._20_4_ = fVar183;
      fVar192 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar119._24_4_);
      auVar132._24_4_ = fVar192;
      auVar132._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar119._28_4_;
      bVar13 = (bool)((byte)uVar81 & 1);
      auVar133._0_4_ = (float)((uint)bVar13 * auVar120._0_4_ | (uint)!bVar13 * auVar131._0_4_);
      bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar133._4_4_ = (float)((uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * auVar131._4_4_);
      bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar133._8_4_ = (float)((uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * auVar131._8_4_);
      bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar133._12_4_ = (float)((uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * auVar131._12_4_);
      bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar133._16_4_ = (float)((uint)bVar13 * auVar120._16_4_ | (uint)!bVar13 * auVar131._16_4_);
      bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar133._20_4_ = (float)((uint)bVar13 * auVar120._20_4_ | (uint)!bVar13 * auVar131._20_4_);
      bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar133._24_4_ = (float)((uint)bVar13 * auVar120._24_4_ | (uint)!bVar13 * auVar131._24_4_);
      bVar13 = SUB81(uVar81 >> 7,0);
      auVar133._28_4_ = (uint)bVar13 * auVar120._28_4_ | (uint)!bVar13 * auVar131._28_4_;
      auVar113 = vxorps_avx512vl(auVar198,auVar198);
      auVar125 = vfmadd213ps_avx512vl(auVar123,auVar123,ZEXT1632(auVar113));
      auVar106 = vfmadd231ps_fma(auVar125,auVar124,auVar124);
      auVar125 = vrsqrt14ps_avx512vl(ZEXT1632(auVar106));
      fVar91 = auVar125._0_4_;
      fVar92 = auVar125._4_4_;
      fVar156 = auVar125._8_4_;
      fVar157 = auVar125._12_4_;
      fVar158 = auVar125._16_4_;
      fVar159 = auVar125._20_4_;
      fVar160 = auVar125._24_4_;
      auVar127._4_4_ = fVar92 * fVar92 * fVar92 * auVar106._4_4_ * -0.5;
      auVar127._0_4_ = fVar91 * fVar91 * fVar91 * auVar106._0_4_ * -0.5;
      auVar127._8_4_ = fVar156 * fVar156 * fVar156 * auVar106._8_4_ * -0.5;
      auVar127._12_4_ = fVar157 * fVar157 * fVar157 * auVar106._12_4_ * -0.5;
      auVar127._16_4_ = fVar158 * fVar158 * fVar158 * -0.0;
      auVar127._20_4_ = fVar159 * fVar159 * fVar159 * -0.0;
      auVar127._24_4_ = fVar160 * fVar160 * fVar160 * -0.0;
      auVar127._28_4_ = 0;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar116,auVar125);
      auVar131._4_4_ = auVar124._4_4_ * auVar127._4_4_;
      auVar131._0_4_ = auVar124._0_4_ * auVar127._0_4_;
      auVar131._8_4_ = auVar124._8_4_ * auVar127._8_4_;
      auVar131._12_4_ = auVar124._12_4_ * auVar127._12_4_;
      auVar131._16_4_ = auVar124._16_4_ * auVar127._16_4_;
      auVar131._20_4_ = auVar124._20_4_ * auVar127._20_4_;
      auVar131._24_4_ = auVar124._24_4_ * auVar127._24_4_;
      auVar131._28_4_ = auVar125._28_4_;
      auVar129._4_4_ = auVar127._4_4_ * -auVar123._4_4_;
      auVar129._0_4_ = auVar127._0_4_ * -auVar123._0_4_;
      auVar129._8_4_ = auVar127._8_4_ * -auVar123._8_4_;
      auVar129._12_4_ = auVar127._12_4_ * -auVar123._12_4_;
      auVar129._16_4_ = auVar127._16_4_ * -fVar224;
      auVar129._20_4_ = auVar127._20_4_ * -fVar222;
      auVar129._24_4_ = auVar127._24_4_ * -fVar178;
      auVar129._28_4_ = uVar82 ^ 0x80000000;
      auVar125 = vmulps_avx512vl(auVar127,ZEXT1632(auVar113));
      auVar120 = ZEXT1632(auVar113);
      auVar128 = vfmadd213ps_avx512vl(auVar132,auVar132,auVar120);
      auVar106 = vfmadd231ps_fma(auVar128,auVar133,auVar133);
      auVar130 = vrsqrt14ps_avx512vl(ZEXT1632(auVar106));
      fVar222 = auVar130._0_4_;
      fVar224 = auVar130._4_4_;
      fVar178 = auVar130._8_4_;
      fVar91 = auVar130._12_4_;
      fVar92 = auVar130._16_4_;
      fVar156 = auVar130._20_4_;
      fVar157 = auVar130._24_4_;
      auVar128._4_4_ = fVar224 * fVar224 * fVar224 * auVar106._4_4_ * -0.5;
      auVar128._0_4_ = fVar222 * fVar222 * fVar222 * auVar106._0_4_ * -0.5;
      auVar128._8_4_ = fVar178 * fVar178 * fVar178 * auVar106._8_4_ * -0.5;
      auVar128._12_4_ = fVar91 * fVar91 * fVar91 * auVar106._12_4_ * -0.5;
      auVar128._16_4_ = fVar92 * fVar92 * fVar92 * -0.0;
      auVar128._20_4_ = fVar156 * fVar156 * fVar156 * -0.0;
      auVar128._24_4_ = fVar157 * fVar157 * fVar157 * -0.0;
      auVar128._28_4_ = 0;
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar116,auVar130);
      auVar116._4_4_ = auVar133._4_4_ * auVar128._4_4_;
      auVar116._0_4_ = auVar133._0_4_ * auVar128._0_4_;
      auVar116._8_4_ = auVar133._8_4_ * auVar128._8_4_;
      auVar116._12_4_ = auVar133._12_4_ * auVar128._12_4_;
      auVar116._16_4_ = auVar133._16_4_ * auVar128._16_4_;
      auVar116._20_4_ = auVar133._20_4_ * auVar128._20_4_;
      auVar116._24_4_ = auVar133._24_4_ * auVar128._24_4_;
      auVar116._28_4_ = auVar130._28_4_;
      auVar130._4_4_ = -auVar132._4_4_ * auVar128._4_4_;
      auVar130._0_4_ = -auVar132._0_4_ * auVar128._0_4_;
      auVar130._8_4_ = -auVar132._8_4_ * auVar128._8_4_;
      auVar130._12_4_ = -auVar132._12_4_ * auVar128._12_4_;
      auVar130._16_4_ = -fVar193 * auVar128._16_4_;
      auVar130._20_4_ = -fVar183 * auVar128._20_4_;
      auVar130._24_4_ = -fVar192 * auVar128._24_4_;
      auVar130._28_4_ = auVar127._28_4_;
      auVar127 = vmulps_avx512vl(auVar128,auVar120);
      auVar106 = vfmadd213ps_fma(auVar131,auVar122,auVar118);
      auVar109 = vfmadd213ps_fma(auVar129,auVar122,auVar117);
      auVar128 = vfmadd213ps_avx512vl(auVar125,auVar122,auVar126);
      auVar119 = vfmadd213ps_avx512vl(auVar116,ZEXT1632(auVar101),ZEXT1632(auVar99));
      auVar103 = vfnmadd213ps_fma(auVar131,auVar122,auVar118);
      auVar118 = ZEXT1632(auVar101);
      auVar108 = vfmadd213ps_fma(auVar130,auVar118,ZEXT1632(auVar100));
      auVar112 = vfnmadd213ps_fma(auVar129,auVar122,auVar117);
      auVar27 = vfmadd213ps_fma(auVar127,auVar118,auVar115);
      auVar131 = vfnmadd231ps_avx512vl(auVar126,auVar122,auVar125);
      auVar99 = vfnmadd213ps_fma(auVar116,auVar118,ZEXT1632(auVar99));
      auVar100 = vfnmadd213ps_fma(auVar130,auVar118,ZEXT1632(auVar100));
      auVar239 = vfnmadd231ps_fma(auVar115,ZEXT1632(auVar101),auVar127);
      auVar127 = vsubps_avx512vl(auVar119,ZEXT1632(auVar103));
      auVar125 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar112));
      auVar129 = vsubps_avx512vl(ZEXT1632(auVar27),auVar131);
      auVar115 = vmulps_avx512vl(auVar125,auVar131);
      auVar102 = vfmsub231ps_fma(auVar115,ZEXT1632(auVar112),auVar129);
      auVar126._4_4_ = auVar103._4_4_ * auVar129._4_4_;
      auVar126._0_4_ = auVar103._0_4_ * auVar129._0_4_;
      auVar126._8_4_ = auVar103._8_4_ * auVar129._8_4_;
      auVar126._12_4_ = auVar103._12_4_ * auVar129._12_4_;
      auVar126._16_4_ = auVar129._16_4_ * 0.0;
      auVar126._20_4_ = auVar129._20_4_ * 0.0;
      auVar126._24_4_ = auVar129._24_4_ * 0.0;
      auVar126._28_4_ = auVar129._28_4_;
      auVar129 = vfmsub231ps_avx512vl(auVar126,auVar131,auVar127);
      auVar117._4_4_ = auVar112._4_4_ * auVar127._4_4_;
      auVar117._0_4_ = auVar112._0_4_ * auVar127._0_4_;
      auVar117._8_4_ = auVar112._8_4_ * auVar127._8_4_;
      auVar117._12_4_ = auVar112._12_4_ * auVar127._12_4_;
      auVar117._16_4_ = auVar127._16_4_ * 0.0;
      auVar117._20_4_ = auVar127._20_4_ * 0.0;
      auVar117._24_4_ = auVar127._24_4_ * 0.0;
      auVar117._28_4_ = auVar127._28_4_;
      auVar98 = vfmsub231ps_fma(auVar117,ZEXT1632(auVar103),auVar125);
      auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar120,auVar129);
      auVar125 = vfmadd231ps_avx512vl(auVar125,auVar120,ZEXT1632(auVar102));
      auVar123 = ZEXT1632(auVar113);
      uVar81 = vcmpps_avx512vl(auVar125,auVar123,2);
      bVar80 = (byte)uVar81;
      fVar91 = (float)((uint)(bVar80 & 1) * auVar106._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar99._0_4_);
      bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
      fVar156 = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar99._4_4_);
      bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
      fVar158 = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar99._8_4_);
      bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
      fVar160 = (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar99._12_4_);
      auVar116 = ZEXT1632(CONCAT412(fVar160,CONCAT48(fVar158,CONCAT44(fVar156,fVar91))));
      fVar92 = (float)((uint)(bVar80 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar100._0_4_);
      bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
      fVar157 = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar100._4_4_);
      bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
      fVar159 = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar100._8_4_);
      bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
      fVar161 = (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar100._12_4_);
      auVar130 = ZEXT1632(CONCAT412(fVar161,CONCAT48(fVar159,CONCAT44(fVar157,fVar92))));
      auVar134._0_4_ =
           (float)((uint)(bVar80 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar239._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar134._4_4_ = (float)((uint)bVar13 * auVar128._4_4_ | (uint)!bVar13 * auVar239._4_4_);
      bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar134._8_4_ = (float)((uint)bVar13 * auVar128._8_4_ | (uint)!bVar13 * auVar239._8_4_);
      bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar134._12_4_ = (float)((uint)bVar13 * auVar128._12_4_ | (uint)!bVar13 * auVar239._12_4_);
      fVar222 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar128._16_4_);
      auVar134._16_4_ = fVar222;
      fVar224 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar128._20_4_);
      auVar134._20_4_ = fVar224;
      fVar178 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar128._24_4_);
      auVar134._24_4_ = fVar178;
      iVar1 = (uint)(byte)(uVar81 >> 7) * auVar128._28_4_;
      auVar134._28_4_ = iVar1;
      auVar127 = vblendmps_avx512vl(ZEXT1632(auVar103),auVar119);
      auVar135._0_4_ =
           (uint)(bVar80 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar109._0_4_;
      bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar135._4_4_ = (uint)bVar13 * auVar127._4_4_ | (uint)!bVar13 * auVar109._4_4_;
      bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar135._8_4_ = (uint)bVar13 * auVar127._8_4_ | (uint)!bVar13 * auVar109._8_4_;
      bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar135._12_4_ = (uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * auVar109._12_4_;
      auVar135._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar127._16_4_;
      auVar135._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar127._20_4_;
      auVar135._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar127._24_4_;
      auVar135._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar127._28_4_;
      auVar127 = vblendmps_avx512vl(ZEXT1632(auVar112),ZEXT1632(auVar108));
      auVar136._0_4_ =
           (float)((uint)(bVar80 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar102._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar136._4_4_ = (float)((uint)bVar13 * auVar127._4_4_ | (uint)!bVar13 * auVar102._4_4_);
      bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar136._8_4_ = (float)((uint)bVar13 * auVar127._8_4_ | (uint)!bVar13 * auVar102._8_4_);
      bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar136._12_4_ = (float)((uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * auVar102._12_4_);
      fVar193 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar127._16_4_);
      auVar136._16_4_ = fVar193;
      fVar192 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar127._20_4_);
      auVar136._20_4_ = fVar192;
      fVar183 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar127._24_4_);
      auVar136._24_4_ = fVar183;
      auVar136._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar127._28_4_;
      auVar127 = vblendmps_avx512vl(auVar131,ZEXT1632(auVar27));
      auVar137._0_4_ =
           (float)((uint)(bVar80 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar128._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar137._4_4_ = (float)((uint)bVar13 * auVar127._4_4_ | (uint)!bVar13 * auVar128._4_4_);
      bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar137._8_4_ = (float)((uint)bVar13 * auVar127._8_4_ | (uint)!bVar13 * auVar128._8_4_);
      bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar137._12_4_ = (float)((uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * auVar128._12_4_);
      bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar137._16_4_ = (float)((uint)bVar13 * auVar127._16_4_ | (uint)!bVar13 * auVar128._16_4_);
      bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar137._20_4_ = (float)((uint)bVar13 * auVar127._20_4_ | (uint)!bVar13 * auVar128._20_4_);
      bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar137._24_4_ = (float)((uint)bVar13 * auVar127._24_4_ | (uint)!bVar13 * auVar128._24_4_);
      bVar13 = SUB81(uVar81 >> 7,0);
      auVar137._28_4_ = (uint)bVar13 * auVar127._28_4_ | (uint)!bVar13 * auVar128._28_4_;
      auVar138._0_4_ =
           (uint)(bVar80 & 1) * (int)auVar103._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar119._0_4_;
      bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar138._4_4_ = (uint)bVar13 * (int)auVar103._4_4_ | (uint)!bVar13 * auVar119._4_4_;
      bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar138._8_4_ = (uint)bVar13 * (int)auVar103._8_4_ | (uint)!bVar13 * auVar119._8_4_;
      bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar138._12_4_ = (uint)bVar13 * (int)auVar103._12_4_ | (uint)!bVar13 * auVar119._12_4_;
      auVar138._16_4_ = (uint)!(bool)((byte)(uVar81 >> 4) & 1) * auVar119._16_4_;
      auVar138._20_4_ = (uint)!(bool)((byte)(uVar81 >> 5) & 1) * auVar119._20_4_;
      auVar138._24_4_ = (uint)!(bool)((byte)(uVar81 >> 6) & 1) * auVar119._24_4_;
      auVar138._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar119._28_4_;
      bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar81 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar139._0_4_ =
           (uint)(bVar80 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar27._0_4_;
      bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar139._4_4_ = (uint)bVar14 * auVar131._4_4_ | (uint)!bVar14 * auVar27._4_4_;
      bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar139._8_4_ = (uint)bVar14 * auVar131._8_4_ | (uint)!bVar14 * auVar27._8_4_;
      bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar139._12_4_ = (uint)bVar14 * auVar131._12_4_ | (uint)!bVar14 * auVar27._12_4_;
      auVar139._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar131._16_4_;
      auVar139._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar131._20_4_;
      auVar139._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar131._24_4_;
      iVar2 = (uint)(byte)(uVar81 >> 7) * auVar131._28_4_;
      auVar139._28_4_ = iVar2;
      auVar126 = vsubps_avx512vl(auVar138,auVar116);
      auVar127 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar112._12_4_ |
                                               (uint)!bVar16 * auVar108._12_4_,
                                               CONCAT48((uint)bVar15 * (int)auVar112._8_4_ |
                                                        (uint)!bVar15 * auVar108._8_4_,
                                                        CONCAT44((uint)bVar13 * (int)auVar112._4_4_
                                                                 | (uint)!bVar13 * auVar108._4_4_,
                                                                 (uint)(bVar80 & 1) *
                                                                 (int)auVar112._0_4_ |
                                                                 (uint)!(bool)(bVar80 & 1) *
                                                                 auVar108._0_4_)))),auVar130);
      auVar218 = ZEXT3264(auVar127);
      auVar131 = vsubps_avx(auVar139,auVar134);
      auVar129 = vsubps_avx(auVar116,auVar135);
      auVar220 = ZEXT3264(auVar129);
      auVar128 = vsubps_avx(auVar130,auVar136);
      auVar115 = vsubps_avx(auVar134,auVar137);
      auVar118._4_4_ = auVar131._4_4_ * fVar156;
      auVar118._0_4_ = auVar131._0_4_ * fVar91;
      auVar118._8_4_ = auVar131._8_4_ * fVar158;
      auVar118._12_4_ = auVar131._12_4_ * fVar160;
      auVar118._16_4_ = auVar131._16_4_ * 0.0;
      auVar118._20_4_ = auVar131._20_4_ * 0.0;
      auVar118._24_4_ = auVar131._24_4_ * 0.0;
      auVar118._28_4_ = iVar2;
      auVar106 = vfmsub231ps_fma(auVar118,auVar134,auVar126);
      auVar119._4_4_ = fVar157 * auVar126._4_4_;
      auVar119._0_4_ = fVar92 * auVar126._0_4_;
      auVar119._8_4_ = fVar159 * auVar126._8_4_;
      auVar119._12_4_ = fVar161 * auVar126._12_4_;
      auVar119._16_4_ = auVar126._16_4_ * 0.0;
      auVar119._20_4_ = auVar126._20_4_ * 0.0;
      auVar119._24_4_ = auVar126._24_4_ * 0.0;
      auVar119._28_4_ = auVar125._28_4_;
      auVar109 = vfmsub231ps_fma(auVar119,auVar116,auVar127);
      auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar109),auVar123,ZEXT1632(auVar106));
      auVar208._0_4_ = auVar127._0_4_ * auVar134._0_4_;
      auVar208._4_4_ = auVar127._4_4_ * auVar134._4_4_;
      auVar208._8_4_ = auVar127._8_4_ * auVar134._8_4_;
      auVar208._12_4_ = auVar127._12_4_ * auVar134._12_4_;
      auVar208._16_4_ = auVar127._16_4_ * fVar222;
      auVar208._20_4_ = auVar127._20_4_ * fVar224;
      auVar208._24_4_ = auVar127._24_4_ * fVar178;
      auVar208._28_4_ = 0;
      auVar106 = vfmsub231ps_fma(auVar208,auVar130,auVar131);
      auVar117 = vfmadd231ps_avx512vl(auVar125,auVar123,ZEXT1632(auVar106));
      auVar125 = vmulps_avx512vl(auVar115,auVar135);
      auVar125 = vfmsub231ps_avx512vl(auVar125,auVar129,auVar137);
      auVar120._4_4_ = auVar128._4_4_ * auVar137._4_4_;
      auVar120._0_4_ = auVar128._0_4_ * auVar137._0_4_;
      auVar120._8_4_ = auVar128._8_4_ * auVar137._8_4_;
      auVar120._12_4_ = auVar128._12_4_ * auVar137._12_4_;
      auVar120._16_4_ = auVar128._16_4_ * auVar137._16_4_;
      auVar120._20_4_ = auVar128._20_4_ * auVar137._20_4_;
      auVar120._24_4_ = auVar128._24_4_ * auVar137._24_4_;
      auVar120._28_4_ = auVar137._28_4_;
      auVar106 = vfmsub231ps_fma(auVar120,auVar136,auVar115);
      auVar209._0_4_ = auVar136._0_4_ * auVar129._0_4_;
      auVar209._4_4_ = auVar136._4_4_ * auVar129._4_4_;
      auVar209._8_4_ = auVar136._8_4_ * auVar129._8_4_;
      auVar209._12_4_ = auVar136._12_4_ * auVar129._12_4_;
      auVar209._16_4_ = fVar193 * auVar129._16_4_;
      auVar209._20_4_ = fVar192 * auVar129._20_4_;
      auVar209._24_4_ = fVar183 * auVar129._24_4_;
      auVar209._28_4_ = 0;
      auVar109 = vfmsub231ps_fma(auVar209,auVar128,auVar135);
      auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar109),auVar123,auVar125);
      auVar118 = vfmadd231ps_avx512vl(auVar125,auVar123,ZEXT1632(auVar106));
      auVar212 = ZEXT3264(auVar118);
      auVar125 = vmaxps_avx(auVar117,auVar118);
      uVar179 = vcmpps_avx512vl(auVar125,auVar123,2);
      bVar89 = bVar89 & (byte)uVar179;
      if (bVar89 != 0) {
        auVar40._4_4_ = auVar115._4_4_ * auVar127._4_4_;
        auVar40._0_4_ = auVar115._0_4_ * auVar127._0_4_;
        auVar40._8_4_ = auVar115._8_4_ * auVar127._8_4_;
        auVar40._12_4_ = auVar115._12_4_ * auVar127._12_4_;
        auVar40._16_4_ = auVar115._16_4_ * auVar127._16_4_;
        auVar40._20_4_ = auVar115._20_4_ * auVar127._20_4_;
        auVar40._24_4_ = auVar115._24_4_ * auVar127._24_4_;
        auVar40._28_4_ = auVar125._28_4_;
        auVar27 = vfmsub231ps_fma(auVar40,auVar128,auVar131);
        auVar41._4_4_ = auVar131._4_4_ * auVar129._4_4_;
        auVar41._0_4_ = auVar131._0_4_ * auVar129._0_4_;
        auVar41._8_4_ = auVar131._8_4_ * auVar129._8_4_;
        auVar41._12_4_ = auVar131._12_4_ * auVar129._12_4_;
        auVar41._16_4_ = auVar131._16_4_ * auVar129._16_4_;
        auVar41._20_4_ = auVar131._20_4_ * auVar129._20_4_;
        auVar41._24_4_ = auVar131._24_4_ * auVar129._24_4_;
        auVar41._28_4_ = auVar131._28_4_;
        auVar108 = vfmsub231ps_fma(auVar41,auVar126,auVar115);
        auVar42._4_4_ = auVar128._4_4_ * auVar126._4_4_;
        auVar42._0_4_ = auVar128._0_4_ * auVar126._0_4_;
        auVar42._8_4_ = auVar128._8_4_ * auVar126._8_4_;
        auVar42._12_4_ = auVar128._12_4_ * auVar126._12_4_;
        auVar42._16_4_ = auVar128._16_4_ * auVar126._16_4_;
        auVar42._20_4_ = auVar128._20_4_ * auVar126._20_4_;
        auVar42._24_4_ = auVar128._24_4_ * auVar126._24_4_;
        auVar42._28_4_ = auVar128._28_4_;
        auVar102 = vfmsub231ps_fma(auVar42,auVar129,auVar127);
        auVar106 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar108),ZEXT1632(auVar102));
        auVar109 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar27),ZEXT1232(ZEXT412(0)) << 0x20
                                  );
        auVar125 = vrcp14ps_avx512vl(ZEXT1632(auVar109));
        auVar33._8_4_ = 0x3f800000;
        auVar33._0_8_ = 0x3f8000003f800000;
        auVar33._12_4_ = 0x3f800000;
        auVar33._16_4_ = 0x3f800000;
        auVar33._20_4_ = 0x3f800000;
        auVar33._24_4_ = 0x3f800000;
        auVar33._28_4_ = 0x3f800000;
        auVar127 = vfnmadd213ps_avx512vl(auVar125,ZEXT1632(auVar109),auVar33);
        auVar106 = vfmadd132ps_fma(auVar127,auVar125,auVar125);
        auVar218 = ZEXT1664(auVar106);
        auVar43._4_4_ = auVar102._4_4_ * auVar134._4_4_;
        auVar43._0_4_ = auVar102._0_4_ * auVar134._0_4_;
        auVar43._8_4_ = auVar102._8_4_ * auVar134._8_4_;
        auVar43._12_4_ = auVar102._12_4_ * auVar134._12_4_;
        auVar43._16_4_ = fVar222 * 0.0;
        auVar43._20_4_ = fVar224 * 0.0;
        auVar43._24_4_ = fVar178 * 0.0;
        auVar43._28_4_ = iVar1;
        auVar108 = vfmadd231ps_fma(auVar43,auVar130,ZEXT1632(auVar108));
        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar116,ZEXT1632(auVar27));
        fVar222 = auVar106._0_4_;
        fVar224 = auVar106._4_4_;
        fVar178 = auVar106._8_4_;
        fVar193 = auVar106._12_4_;
        local_5c0._28_4_ = auVar125._28_4_;
        local_5c0._0_28_ =
             ZEXT1628(CONCAT412(auVar108._12_4_ * fVar193,
                                CONCAT48(auVar108._8_4_ * fVar178,
                                         CONCAT44(auVar108._4_4_ * fVar224,auVar108._0_4_ * fVar222)
                                        )));
        auVar220 = ZEXT3264(local_5c0);
        auVar168._4_4_ = local_760;
        auVar168._0_4_ = local_760;
        auVar168._8_4_ = local_760;
        auVar168._12_4_ = local_760;
        auVar168._16_4_ = local_760;
        auVar168._20_4_ = local_760;
        auVar168._24_4_ = local_760;
        auVar168._28_4_ = local_760;
        uVar179 = vcmpps_avx512vl(auVar168,local_5c0,2);
        uVar177 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar34._4_4_ = uVar177;
        auVar34._0_4_ = uVar177;
        auVar34._8_4_ = uVar177;
        auVar34._12_4_ = uVar177;
        auVar34._16_4_ = uVar177;
        auVar34._20_4_ = uVar177;
        auVar34._24_4_ = uVar177;
        auVar34._28_4_ = uVar177;
        uVar30 = vcmpps_avx512vl(local_5c0,auVar34,2);
        bVar89 = (byte)uVar179 & (byte)uVar30 & bVar89;
        if (bVar89 != 0) {
          uVar90 = vcmpps_avx512vl(ZEXT1632(auVar109),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar90 = bVar89 & uVar90;
          if ((char)uVar90 != '\0') {
            fVar183 = auVar117._0_4_ * fVar222;
            fVar192 = auVar117._4_4_ * fVar224;
            auVar44._4_4_ = fVar192;
            auVar44._0_4_ = fVar183;
            fVar91 = auVar117._8_4_ * fVar178;
            auVar44._8_4_ = fVar91;
            fVar92 = auVar117._12_4_ * fVar193;
            auVar44._12_4_ = fVar92;
            fVar156 = auVar117._16_4_ * 0.0;
            auVar44._16_4_ = fVar156;
            fVar157 = auVar117._20_4_ * 0.0;
            auVar44._20_4_ = fVar157;
            fVar158 = auVar117._24_4_ * 0.0;
            auVar44._24_4_ = fVar158;
            auVar44._28_4_ = auVar117._28_4_;
            auVar169._8_4_ = 0x3f800000;
            auVar169._0_8_ = 0x3f8000003f800000;
            auVar169._12_4_ = 0x3f800000;
            auVar169._16_4_ = 0x3f800000;
            auVar169._20_4_ = 0x3f800000;
            auVar169._24_4_ = 0x3f800000;
            auVar169._28_4_ = 0x3f800000;
            auVar125 = vsubps_avx(auVar169,auVar44);
            local_600._0_4_ =
                 (float)((uint)(bVar80 & 1) * (int)fVar183 |
                        (uint)!(bool)(bVar80 & 1) * auVar125._0_4_);
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            local_600._4_4_ = (float)((uint)bVar13 * (int)fVar192 | (uint)!bVar13 * auVar125._4_4_);
            bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
            local_600._8_4_ = (float)((uint)bVar13 * (int)fVar91 | (uint)!bVar13 * auVar125._8_4_);
            bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
            local_600._12_4_ = (float)((uint)bVar13 * (int)fVar92 | (uint)!bVar13 * auVar125._12_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
            local_600._16_4_ =
                 (float)((uint)bVar13 * (int)fVar156 | (uint)!bVar13 * auVar125._16_4_);
            bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
            local_600._20_4_ =
                 (float)((uint)bVar13 * (int)fVar157 | (uint)!bVar13 * auVar125._20_4_);
            bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
            local_600._24_4_ =
                 (float)((uint)bVar13 * (int)fVar158 | (uint)!bVar13 * auVar125._24_4_);
            bVar13 = SUB81(uVar81 >> 7,0);
            local_600._28_4_ =
                 (float)((uint)bVar13 * auVar117._28_4_ | (uint)!bVar13 * auVar125._28_4_);
            auVar125 = vsubps_avx(ZEXT1632(auVar101),auVar122);
            auVar106 = vfmadd213ps_fma(auVar125,local_600,auVar122);
            uVar177 = *(undefined4 *)((long)local_7e0->ray_space + k * 4 + -0x40);
            auVar122._4_4_ = uVar177;
            auVar122._0_4_ = uVar177;
            auVar122._8_4_ = uVar177;
            auVar122._12_4_ = uVar177;
            auVar122._16_4_ = uVar177;
            auVar122._20_4_ = uVar177;
            auVar122._24_4_ = uVar177;
            auVar122._28_4_ = uVar177;
            auVar125 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar106._12_4_ + auVar106._12_4_,
                                                          CONCAT48(auVar106._8_4_ + auVar106._8_4_,
                                                                   CONCAT44(auVar106._4_4_ +
                                                                            auVar106._4_4_,
                                                                            auVar106._0_4_ +
                                                                            auVar106._0_4_)))),
                                       auVar122);
            uVar29 = vcmpps_avx512vl(local_5c0,auVar125,6);
            uVar90 = uVar90 & uVar29;
            bVar89 = (byte)uVar90;
            if (bVar89 != 0) {
              auVar190._0_4_ = auVar118._0_4_ * fVar222;
              auVar190._4_4_ = auVar118._4_4_ * fVar224;
              auVar190._8_4_ = auVar118._8_4_ * fVar178;
              auVar190._12_4_ = auVar118._12_4_ * fVar193;
              auVar190._16_4_ = auVar118._16_4_ * 0.0;
              auVar190._20_4_ = auVar118._20_4_ * 0.0;
              auVar190._24_4_ = auVar118._24_4_ * 0.0;
              auVar190._28_4_ = 0;
              auVar203._8_4_ = 0x3f800000;
              auVar203._0_8_ = 0x3f8000003f800000;
              auVar203._12_4_ = 0x3f800000;
              auVar203._16_4_ = 0x3f800000;
              auVar203._20_4_ = 0x3f800000;
              auVar203._24_4_ = 0x3f800000;
              auVar203._28_4_ = 0x3f800000;
              auVar125 = vsubps_avx(auVar203,auVar190);
              auVar140._0_4_ =
                   (uint)(bVar80 & 1) * (int)auVar190._0_4_ |
                   (uint)!(bool)(bVar80 & 1) * auVar125._0_4_;
              bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
              auVar140._4_4_ = (uint)bVar13 * (int)auVar190._4_4_ | (uint)!bVar13 * auVar125._4_4_;
              bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
              auVar140._8_4_ = (uint)bVar13 * (int)auVar190._8_4_ | (uint)!bVar13 * auVar125._8_4_;
              bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
              auVar140._12_4_ =
                   (uint)bVar13 * (int)auVar190._12_4_ | (uint)!bVar13 * auVar125._12_4_;
              bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
              auVar140._16_4_ =
                   (uint)bVar13 * (int)auVar190._16_4_ | (uint)!bVar13 * auVar125._16_4_;
              bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
              auVar140._20_4_ =
                   (uint)bVar13 * (int)auVar190._20_4_ | (uint)!bVar13 * auVar125._20_4_;
              bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
              auVar140._24_4_ =
                   (uint)bVar13 * (int)auVar190._24_4_ | (uint)!bVar13 * auVar125._24_4_;
              auVar140._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar125._28_4_;
              auVar35._8_4_ = 0x40000000;
              auVar35._0_8_ = 0x4000000040000000;
              auVar35._12_4_ = 0x40000000;
              auVar35._16_4_ = 0x40000000;
              auVar35._20_4_ = 0x40000000;
              auVar35._24_4_ = 0x40000000;
              auVar35._28_4_ = 0x40000000;
              local_5e0 = vfmsub132ps_avx512vl(auVar140,auVar203,auVar35);
              local_5a0 = 0;
              local_590 = local_840;
              uStack_588 = uStack_838;
              local_580 = local_860;
              uStack_578 = uStack_858;
              local_570 = local_870;
              uStack_568 = uStack_868;
              local_560 = local_850;
              uStack_558 = uStack_848;
              if ((pGVar86->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                fVar184 = 1.0 / auVar121._0_4_;
                local_540[0] = fVar184 * (local_600._0_4_ + 0.0);
                local_540[1] = fVar184 * (local_600._4_4_ + 1.0);
                local_540[2] = fVar184 * (local_600._8_4_ + 2.0);
                local_540[3] = fVar184 * (local_600._12_4_ + 3.0);
                fStack_530 = fVar184 * (local_600._16_4_ + 4.0);
                fStack_52c = fVar184 * (local_600._20_4_ + 5.0);
                fStack_528 = fVar184 * (local_600._24_4_ + 6.0);
                fStack_524 = local_600._28_4_ + 7.0;
                local_520 = local_5e0;
                local_500 = local_5c0;
                auVar170._8_4_ = 0x7f800000;
                auVar170._0_8_ = 0x7f8000007f800000;
                auVar170._12_4_ = 0x7f800000;
                auVar170._16_4_ = 0x7f800000;
                auVar170._20_4_ = 0x7f800000;
                auVar170._24_4_ = 0x7f800000;
                auVar170._28_4_ = 0x7f800000;
                auVar125 = vblendmps_avx512vl(auVar170,local_5c0);
                auVar141._0_4_ =
                     (uint)(bVar89 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar89 & 1) * 0x7f800000;
                bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
                auVar141._4_4_ = (uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                auVar141._8_4_ = (uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
                auVar141._12_4_ = (uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                auVar141._16_4_ = (uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar90 >> 5) & 1);
                auVar141._20_4_ = (uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar90 >> 6) & 1);
                auVar141._24_4_ = (uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = SUB81(uVar90 >> 7,0);
                auVar141._28_4_ = (uint)bVar13 * auVar125._28_4_ | (uint)!bVar13 * 0x7f800000;
                auVar125 = vshufps_avx(auVar141,auVar141,0xb1);
                auVar125 = vminps_avx(auVar141,auVar125);
                auVar127 = vshufpd_avx(auVar125,auVar125,5);
                auVar125 = vminps_avx(auVar125,auVar127);
                auVar127 = vpermpd_avx2(auVar125,0x4e);
                auVar125 = vminps_avx(auVar125,auVar127);
                uVar179 = vcmpps_avx512vl(auVar141,auVar125,0);
                uVar82 = (uint)uVar90;
                if ((bVar89 & (byte)uVar179) != 0) {
                  uVar82 = (uint)(bVar89 & (byte)uVar179);
                }
                uVar31 = 0;
                for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                  uVar31 = uVar31 + 1;
                }
                uVar81 = (ulong)uVar31;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar86->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_780 = *(float *)(ray + k * 4 + 0x200);
                  fStack_77c = 0.0;
                  fStack_778 = 0.0;
                  fStack_774 = 0.0;
                  local_7c0 = local_5c0;
                  local_59c = iVar7;
                  do {
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_540[uVar81]));
                    local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_520 + uVar81 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_500 + uVar81 * 4);
                    local_830.context = context->user;
                    fVar178 = local_200._0_4_;
                    fVar222 = 1.0 - fVar178;
                    fVar184 = fVar222 * fVar222 * -3.0;
                    auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * fVar222)),
                                               ZEXT416((uint)(fVar178 * fVar222)),
                                               ZEXT416(0xc0000000));
                    auVar109 = vfmsub132ss_fma(ZEXT416((uint)(fVar178 * fVar222)),
                                               ZEXT416((uint)(fVar178 * fVar178)),
                                               ZEXT416(0x40000000));
                    fVar222 = auVar106._0_4_ * 3.0;
                    fVar224 = auVar109._0_4_ * 3.0;
                    fVar178 = fVar178 * fVar178 * 3.0;
                    auVar217._0_4_ = fVar178 * fVar28;
                    auVar217._4_4_ = fVar178 * fVar62;
                    auVar217._8_4_ = fVar178 * fVar63;
                    auVar217._12_4_ = fVar178 * fVar79;
                    auVar166._4_4_ = fVar224;
                    auVar166._0_4_ = fVar224;
                    auVar166._8_4_ = fVar224;
                    auVar166._12_4_ = fVar224;
                    auVar106 = vfmadd132ps_fma(auVar166,auVar217,auVar105);
                    auVar202._4_4_ = fVar222;
                    auVar202._0_4_ = fVar222;
                    auVar202._8_4_ = fVar222;
                    auVar202._12_4_ = fVar222;
                    auVar106 = vfmadd132ps_fma(auVar202,auVar106,auVar104);
                    auVar167._4_4_ = fVar184;
                    auVar167._0_4_ = fVar184;
                    auVar167._8_4_ = fVar184;
                    auVar167._12_4_ = fVar184;
                    auVar106 = vfmadd132ps_fma(auVar167,auVar106,auVar107);
                    auVar155 = vbroadcastss_avx512f(auVar106);
                    auVar212 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar212 = vpermps_avx512f(auVar212,ZEXT1664(auVar106));
                    auVar218 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar218,ZEXT1664(auVar106));
                    local_2c0[0] = (RTCHitN)auVar155[0];
                    local_2c0[1] = (RTCHitN)auVar155[1];
                    local_2c0[2] = (RTCHitN)auVar155[2];
                    local_2c0[3] = (RTCHitN)auVar155[3];
                    local_2c0[4] = (RTCHitN)auVar155[4];
                    local_2c0[5] = (RTCHitN)auVar155[5];
                    local_2c0[6] = (RTCHitN)auVar155[6];
                    local_2c0[7] = (RTCHitN)auVar155[7];
                    local_2c0[8] = (RTCHitN)auVar155[8];
                    local_2c0[9] = (RTCHitN)auVar155[9];
                    local_2c0[10] = (RTCHitN)auVar155[10];
                    local_2c0[0xb] = (RTCHitN)auVar155[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar155[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar155[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar155[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar155[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar155[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar155[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar155[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar155[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar155[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar155[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar155[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar155[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar155[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar155[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar155[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar155[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar155[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar155[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar155[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar155[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar155[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar155[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar155[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar155[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar155[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar155[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar155[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar155[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar155[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar155[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar155[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar155[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar155[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar155[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar155[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar155[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar155[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar155[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar155[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar155[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar155[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar155[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar155[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar155[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar155[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar155[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar155[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar155[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar155[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar155[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar155[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar155[0x3f];
                    local_280 = auVar212;
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar155 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar155);
                    auVar125 = vpcmpeqd_avx2(auVar155._0_32_,auVar155._0_32_);
                    local_7e8[3] = auVar125;
                    local_7e8[2] = auVar125;
                    local_7e8[1] = auVar125;
                    *local_7e8 = auVar125;
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]));
                    auVar155 = vmovdqa64_avx512f(local_380);
                    local_740 = vmovdqa64_avx512f(auVar155);
                    local_830.valid = (int *)local_740;
                    local_830.geometryUserPtr = pGVar86->userPtr;
                    local_830.hit = local_2c0;
                    local_830.N = 0x10;
                    local_830.ray = (RTCRayN *)ray;
                    if (pGVar86->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar212 = ZEXT1664(auVar212._0_16_);
                      auVar218 = ZEXT1664(auVar218._0_16_);
                      (*pGVar86->intersectionFilterN)(&local_830);
                      auVar220 = ZEXT3264(local_7c0);
                      auVar106 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                      auVar176 = ZEXT1664(auVar106);
                      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar240 = ZEXT1664(auVar106);
                      auVar155 = vmovdqa64_avx512f(local_740);
                    }
                    uVar179 = vptestmd_avx512f(auVar155,auVar155);
                    if ((short)uVar179 == 0) {
LAB_01926782:
                      *(float *)(ray + k * 4 + 0x200) = local_780;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar86->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar212 = ZEXT1664(auVar212._0_16_);
                        auVar218 = ZEXT1664(auVar218._0_16_);
                        (*p_Var12)(&local_830);
                        auVar220 = ZEXT3264(local_7c0);
                        auVar106 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                        auVar176 = ZEXT1664(auVar106);
                        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar240 = ZEXT1664(auVar106);
                        auVar155 = vmovdqa64_avx512f(local_740);
                      }
                      uVar29 = vptestmd_avx512f(auVar155,auVar155);
                      if ((short)uVar29 == 0) goto LAB_01926782;
                      iVar1 = *(int *)(local_830.hit + 4);
                      iVar2 = *(int *)(local_830.hit + 8);
                      iVar64 = *(int *)(local_830.hit + 0xc);
                      iVar65 = *(int *)(local_830.hit + 0x10);
                      iVar66 = *(int *)(local_830.hit + 0x14);
                      iVar67 = *(int *)(local_830.hit + 0x18);
                      iVar68 = *(int *)(local_830.hit + 0x1c);
                      iVar69 = *(int *)(local_830.hit + 0x20);
                      iVar70 = *(int *)(local_830.hit + 0x24);
                      iVar71 = *(int *)(local_830.hit + 0x28);
                      iVar72 = *(int *)(local_830.hit + 0x2c);
                      iVar73 = *(int *)(local_830.hit + 0x30);
                      iVar74 = *(int *)(local_830.hit + 0x34);
                      iVar75 = *(int *)(local_830.hit + 0x38);
                      iVar76 = *(int *)(local_830.hit + 0x3c);
                      bVar89 = (byte)uVar29;
                      bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar80 = (byte)(uVar29 >> 8);
                      bVar20 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar26 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x300) =
                           (uint)(bVar89 & 1) * *(int *)local_830.hit |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_830.ray + 0x300);
                      *(uint *)(local_830.ray + 0x304) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_830.ray + 0x304);
                      *(uint *)(local_830.ray + 0x308) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_830.ray + 0x308);
                      *(uint *)(local_830.ray + 0x30c) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_830.ray + 0x30c);
                      *(uint *)(local_830.ray + 0x310) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_830.ray + 0x310);
                      *(uint *)(local_830.ray + 0x314) =
                           (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_830.ray + 0x314);
                      *(uint *)(local_830.ray + 0x318) =
                           (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_830.ray + 0x318);
                      *(uint *)(local_830.ray + 0x31c) =
                           (uint)bVar19 * iVar68 | (uint)!bVar19 * *(int *)(local_830.ray + 0x31c);
                      *(uint *)(local_830.ray + 800) =
                           (uint)(bVar80 & 1) * iVar69 |
                           (uint)!(bool)(bVar80 & 1) * *(int *)(local_830.ray + 800);
                      *(uint *)(local_830.ray + 0x324) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_830.ray + 0x324);
                      *(uint *)(local_830.ray + 0x328) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_830.ray + 0x328);
                      *(uint *)(local_830.ray + 0x32c) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_830.ray + 0x32c);
                      *(uint *)(local_830.ray + 0x330) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_830.ray + 0x330);
                      *(uint *)(local_830.ray + 0x334) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_830.ray + 0x334);
                      *(uint *)(local_830.ray + 0x338) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_830.ray + 0x338);
                      *(uint *)(local_830.ray + 0x33c) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_830.ray + 0x33c);
                      iVar1 = *(int *)(local_830.hit + 0x44);
                      iVar2 = *(int *)(local_830.hit + 0x48);
                      iVar64 = *(int *)(local_830.hit + 0x4c);
                      iVar65 = *(int *)(local_830.hit + 0x50);
                      iVar66 = *(int *)(local_830.hit + 0x54);
                      iVar67 = *(int *)(local_830.hit + 0x58);
                      iVar68 = *(int *)(local_830.hit + 0x5c);
                      iVar69 = *(int *)(local_830.hit + 0x60);
                      iVar70 = *(int *)(local_830.hit + 100);
                      iVar71 = *(int *)(local_830.hit + 0x68);
                      iVar72 = *(int *)(local_830.hit + 0x6c);
                      iVar73 = *(int *)(local_830.hit + 0x70);
                      iVar74 = *(int *)(local_830.hit + 0x74);
                      iVar75 = *(int *)(local_830.hit + 0x78);
                      iVar76 = *(int *)(local_830.hit + 0x7c);
                      bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar26 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x340) =
                           (uint)(bVar89 & 1) * *(int *)(local_830.hit + 0x40) |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_830.ray + 0x340);
                      *(uint *)(local_830.ray + 0x344) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_830.ray + 0x344);
                      *(uint *)(local_830.ray + 0x348) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_830.ray + 0x348);
                      *(uint *)(local_830.ray + 0x34c) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_830.ray + 0x34c);
                      *(uint *)(local_830.ray + 0x350) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_830.ray + 0x350);
                      *(uint *)(local_830.ray + 0x354) =
                           (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_830.ray + 0x354);
                      *(uint *)(local_830.ray + 0x358) =
                           (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_830.ray + 0x358);
                      *(uint *)(local_830.ray + 0x35c) =
                           (uint)bVar19 * iVar68 | (uint)!bVar19 * *(int *)(local_830.ray + 0x35c);
                      *(uint *)(local_830.ray + 0x360) =
                           (uint)(bVar80 & 1) * iVar69 |
                           (uint)!(bool)(bVar80 & 1) * *(int *)(local_830.ray + 0x360);
                      *(uint *)(local_830.ray + 0x364) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_830.ray + 0x364);
                      *(uint *)(local_830.ray + 0x368) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_830.ray + 0x368);
                      *(uint *)(local_830.ray + 0x36c) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_830.ray + 0x36c);
                      *(uint *)(local_830.ray + 0x370) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_830.ray + 0x370);
                      *(uint *)(local_830.ray + 0x374) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_830.ray + 0x374);
                      *(uint *)(local_830.ray + 0x378) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_830.ray + 0x378);
                      *(uint *)(local_830.ray + 0x37c) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_830.ray + 0x37c);
                      iVar1 = *(int *)(local_830.hit + 0x84);
                      iVar2 = *(int *)(local_830.hit + 0x88);
                      iVar64 = *(int *)(local_830.hit + 0x8c);
                      iVar65 = *(int *)(local_830.hit + 0x90);
                      iVar66 = *(int *)(local_830.hit + 0x94);
                      iVar67 = *(int *)(local_830.hit + 0x98);
                      iVar68 = *(int *)(local_830.hit + 0x9c);
                      iVar69 = *(int *)(local_830.hit + 0xa0);
                      iVar70 = *(int *)(local_830.hit + 0xa4);
                      iVar71 = *(int *)(local_830.hit + 0xa8);
                      iVar72 = *(int *)(local_830.hit + 0xac);
                      iVar73 = *(int *)(local_830.hit + 0xb0);
                      iVar74 = *(int *)(local_830.hit + 0xb4);
                      iVar75 = *(int *)(local_830.hit + 0xb8);
                      iVar76 = *(int *)(local_830.hit + 0xbc);
                      bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar26 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x380) =
                           (uint)(bVar89 & 1) * *(int *)(local_830.hit + 0x80) |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_830.ray + 0x380);
                      *(uint *)(local_830.ray + 900) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_830.ray + 900);
                      *(uint *)(local_830.ray + 0x388) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_830.ray + 0x388);
                      *(uint *)(local_830.ray + 0x38c) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_830.ray + 0x38c);
                      *(uint *)(local_830.ray + 0x390) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_830.ray + 0x390);
                      *(uint *)(local_830.ray + 0x394) =
                           (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_830.ray + 0x394);
                      *(uint *)(local_830.ray + 0x398) =
                           (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_830.ray + 0x398);
                      *(uint *)(local_830.ray + 0x39c) =
                           (uint)bVar19 * iVar68 | (uint)!bVar19 * *(int *)(local_830.ray + 0x39c);
                      *(uint *)(local_830.ray + 0x3a0) =
                           (uint)(bVar80 & 1) * iVar69 |
                           (uint)!(bool)(bVar80 & 1) * *(int *)(local_830.ray + 0x3a0);
                      *(uint *)(local_830.ray + 0x3a4) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_830.ray + 0x3a4);
                      *(uint *)(local_830.ray + 0x3a8) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_830.ray + 0x3a8);
                      *(uint *)(local_830.ray + 0x3ac) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_830.ray + 0x3ac);
                      *(uint *)(local_830.ray + 0x3b0) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_830.ray + 0x3b0);
                      *(uint *)(local_830.ray + 0x3b4) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_830.ray + 0x3b4);
                      *(uint *)(local_830.ray + 0x3b8) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_830.ray + 0x3b8);
                      *(uint *)(local_830.ray + 0x3bc) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_830.ray + 0x3bc);
                      iVar1 = *(int *)(local_830.hit + 0xc4);
                      iVar2 = *(int *)(local_830.hit + 200);
                      iVar64 = *(int *)(local_830.hit + 0xcc);
                      iVar65 = *(int *)(local_830.hit + 0xd0);
                      iVar66 = *(int *)(local_830.hit + 0xd4);
                      iVar67 = *(int *)(local_830.hit + 0xd8);
                      iVar68 = *(int *)(local_830.hit + 0xdc);
                      iVar69 = *(int *)(local_830.hit + 0xe0);
                      iVar70 = *(int *)(local_830.hit + 0xe4);
                      iVar71 = *(int *)(local_830.hit + 0xe8);
                      iVar72 = *(int *)(local_830.hit + 0xec);
                      iVar73 = *(int *)(local_830.hit + 0xf0);
                      iVar74 = *(int *)(local_830.hit + 0xf4);
                      iVar75 = *(int *)(local_830.hit + 0xf8);
                      iVar76 = *(int *)(local_830.hit + 0xfc);
                      bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar26 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x3c0) =
                           (uint)(bVar89 & 1) * *(int *)(local_830.hit + 0xc0) |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_830.ray + 0x3c0);
                      *(uint *)(local_830.ray + 0x3c4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_830.ray + 0x3c4);
                      *(uint *)(local_830.ray + 0x3c8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_830.ray + 0x3c8);
                      *(uint *)(local_830.ray + 0x3cc) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_830.ray + 0x3cc);
                      *(uint *)(local_830.ray + 0x3d0) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_830.ray + 0x3d0);
                      *(uint *)(local_830.ray + 0x3d4) =
                           (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_830.ray + 0x3d4);
                      *(uint *)(local_830.ray + 0x3d8) =
                           (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_830.ray + 0x3d8);
                      *(uint *)(local_830.ray + 0x3dc) =
                           (uint)bVar19 * iVar68 | (uint)!bVar19 * *(int *)(local_830.ray + 0x3dc);
                      *(uint *)(local_830.ray + 0x3e0) =
                           (uint)(bVar80 & 1) * iVar69 |
                           (uint)!(bool)(bVar80 & 1) * *(int *)(local_830.ray + 0x3e0);
                      *(uint *)(local_830.ray + 0x3e4) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_830.ray + 0x3e4);
                      *(uint *)(local_830.ray + 1000) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_830.ray + 1000);
                      *(uint *)(local_830.ray + 0x3ec) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_830.ray + 0x3ec);
                      *(uint *)(local_830.ray + 0x3f0) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_830.ray + 0x3f0);
                      *(uint *)(local_830.ray + 0x3f4) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_830.ray + 0x3f4);
                      *(uint *)(local_830.ray + 0x3f8) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_830.ray + 0x3f8);
                      *(uint *)(local_830.ray + 0x3fc) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_830.ray + 0x3fc);
                      iVar1 = *(int *)(local_830.hit + 0x104);
                      iVar2 = *(int *)(local_830.hit + 0x108);
                      iVar64 = *(int *)(local_830.hit + 0x10c);
                      iVar65 = *(int *)(local_830.hit + 0x110);
                      iVar66 = *(int *)(local_830.hit + 0x114);
                      iVar67 = *(int *)(local_830.hit + 0x118);
                      iVar68 = *(int *)(local_830.hit + 0x11c);
                      iVar69 = *(int *)(local_830.hit + 0x120);
                      iVar70 = *(int *)(local_830.hit + 0x124);
                      iVar71 = *(int *)(local_830.hit + 0x128);
                      iVar72 = *(int *)(local_830.hit + 300);
                      iVar73 = *(int *)(local_830.hit + 0x130);
                      iVar74 = *(int *)(local_830.hit + 0x134);
                      iVar75 = *(int *)(local_830.hit + 0x138);
                      iVar76 = *(int *)(local_830.hit + 0x13c);
                      bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar29 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar29 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar29 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar29 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar29 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar29 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar29 >> 0xe) & 1);
                      bVar26 = SUB81(uVar29 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x400) =
                           (uint)(bVar89 & 1) * *(int *)(local_830.hit + 0x100) |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_830.ray + 0x400);
                      *(uint *)(local_830.ray + 0x404) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_830.ray + 0x404);
                      *(uint *)(local_830.ray + 0x408) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_830.ray + 0x408);
                      *(uint *)(local_830.ray + 0x40c) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_830.ray + 0x40c);
                      *(uint *)(local_830.ray + 0x410) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_830.ray + 0x410);
                      *(uint *)(local_830.ray + 0x414) =
                           (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_830.ray + 0x414);
                      *(uint *)(local_830.ray + 0x418) =
                           (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_830.ray + 0x418);
                      *(uint *)(local_830.ray + 0x41c) =
                           (uint)bVar19 * iVar68 | (uint)!bVar19 * *(int *)(local_830.ray + 0x41c);
                      *(uint *)(local_830.ray + 0x420) =
                           (uint)(bVar80 & 1) * iVar69 |
                           (uint)!(bool)(bVar80 & 1) * *(int *)(local_830.ray + 0x420);
                      *(uint *)(local_830.ray + 0x424) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_830.ray + 0x424);
                      *(uint *)(local_830.ray + 0x428) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_830.ray + 0x428);
                      *(uint *)(local_830.ray + 0x42c) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_830.ray + 0x42c);
                      *(uint *)(local_830.ray + 0x430) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_830.ray + 0x430);
                      *(uint *)(local_830.ray + 0x434) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_830.ray + 0x434);
                      *(uint *)(local_830.ray + 0x438) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_830.ray + 0x438);
                      *(uint *)(local_830.ray + 0x43c) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_830.ray + 0x43c);
                      auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140));
                      auVar155 = vmovdqu32_avx512f(auVar155);
                      *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar155;
                      auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180));
                      auVar155 = vmovdqu32_avx512f(auVar155);
                      *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar155;
                      auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0));
                      auVar155 = vmovdqa32_avx512f(auVar155);
                      *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar155;
                      auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200));
                      auVar155 = vmovdqa32_avx512f(auVar155);
                      *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar155;
                      local_780 = *(float *)(ray + k * 4 + 0x200);
                      fStack_77c = 0.0;
                      fStack_778 = 0.0;
                      fStack_774 = 0.0;
                    }
                    bVar89 = ~(byte)(1 << ((uint)uVar81 & 0x1f)) & (byte)uVar90;
                    auVar174._4_4_ = local_780;
                    auVar174._0_4_ = local_780;
                    auVar174._8_4_ = local_780;
                    auVar174._12_4_ = local_780;
                    auVar174._16_4_ = local_780;
                    auVar174._20_4_ = local_780;
                    auVar174._24_4_ = local_780;
                    auVar174._28_4_ = local_780;
                    uVar179 = vcmpps_avx512vl(auVar220._0_32_,auVar174,2);
                    if ((bVar89 & (byte)uVar179) == 0) goto LAB_01925717;
                    bVar89 = bVar89 & (byte)uVar179;
                    uVar90 = (ulong)bVar89;
                    auVar175._8_4_ = 0x7f800000;
                    auVar175._0_8_ = 0x7f8000007f800000;
                    auVar175._12_4_ = 0x7f800000;
                    auVar175._16_4_ = 0x7f800000;
                    auVar175._20_4_ = 0x7f800000;
                    auVar175._24_4_ = 0x7f800000;
                    auVar175._28_4_ = 0x7f800000;
                    auVar125 = vblendmps_avx512vl(auVar175,auVar220._0_32_);
                    auVar154._0_4_ =
                         (uint)(bVar89 & 1) * auVar125._0_4_ |
                         (uint)!(bool)(bVar89 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar89 >> 1 & 1);
                    auVar154._4_4_ = (uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar89 >> 2 & 1);
                    auVar154._8_4_ = (uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar89 >> 3 & 1);
                    auVar154._12_4_ = (uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar89 >> 4 & 1);
                    auVar154._16_4_ = (uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar89 >> 5 & 1);
                    auVar154._20_4_ = (uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar89 >> 6 & 1);
                    auVar154._24_4_ = (uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar154._28_4_ =
                         (uint)(bVar89 >> 7) * auVar125._28_4_ |
                         (uint)!(bool)(bVar89 >> 7) * 0x7f800000;
                    auVar125 = vshufps_avx(auVar154,auVar154,0xb1);
                    auVar125 = vminps_avx(auVar154,auVar125);
                    auVar127 = vshufpd_avx(auVar125,auVar125,5);
                    auVar125 = vminps_avx(auVar125,auVar127);
                    auVar127 = vpermpd_avx2(auVar125,0x4e);
                    auVar125 = vminps_avx(auVar125,auVar127);
                    uVar179 = vcmpps_avx512vl(auVar154,auVar125,0);
                    bVar80 = (byte)uVar179 & bVar89;
                    if (bVar80 != 0) {
                      bVar89 = bVar80;
                    }
                    uVar83 = 0;
                    for (uVar82 = (uint)bVar89; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000
                        ) {
                      uVar83 = uVar83 + 1;
                    }
                    uVar81 = (ulong)uVar83;
                  } while( true );
                }
                fVar184 = local_540[uVar81];
                uVar177 = *(undefined4 *)(local_520 + uVar81 * 4);
                fVar224 = 1.0 - fVar184;
                fVar222 = fVar224 * fVar224 * -3.0;
                auVar212 = ZEXT464((uint)fVar222);
                auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * fVar224)),
                                           ZEXT416((uint)(fVar184 * fVar224)),ZEXT416(0xc0000000));
                auVar109 = vfmsub132ss_fma(ZEXT416((uint)(fVar184 * fVar224)),
                                           ZEXT416((uint)(fVar184 * fVar184)),ZEXT416(0x40000000));
                fVar224 = auVar106._0_4_ * 3.0;
                fVar178 = auVar109._0_4_ * 3.0;
                fVar193 = fVar184 * fVar184 * 3.0;
                auVar214._0_4_ = fVar193 * fVar28;
                auVar214._4_4_ = fVar193 * fVar62;
                auVar214._8_4_ = fVar193 * fVar63;
                auVar214._12_4_ = fVar193 * fVar79;
                auVar218 = ZEXT1664(auVar214);
                auVar186._4_4_ = fVar178;
                auVar186._0_4_ = fVar178;
                auVar186._8_4_ = fVar178;
                auVar186._12_4_ = fVar178;
                auVar106 = vfmadd132ps_fma(auVar186,auVar214,auVar105);
                auVar199._4_4_ = fVar224;
                auVar199._0_4_ = fVar224;
                auVar199._8_4_ = fVar224;
                auVar199._12_4_ = fVar224;
                auVar106 = vfmadd132ps_fma(auVar199,auVar106,auVar104);
                auVar187._4_4_ = fVar222;
                auVar187._0_4_ = fVar222;
                auVar187._8_4_ = fVar222;
                auVar187._12_4_ = fVar222;
                auVar106 = vfmadd132ps_fma(auVar187,auVar106,auVar107);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_500 + uVar81 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar106._0_4_;
                uVar8 = vextractps_avx(auVar106,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar8;
                uVar8 = vextractps_avx(auVar106,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar8;
                *(float *)(ray + k * 4 + 0x3c0) = fVar184;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar177;
                *(uint *)(ray + k * 4 + 0x440) = uVar83;
                *(uint *)(ray + k * 4 + 0x480) = uVar6;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
LAB_01925717:
                fVar184 = (float)local_800._0_4_;
              }
            }
          }
        }
      }
    }
    local_800._0_4_ = fVar184;
    if (8 < iVar7) {
      auVar125 = vpbroadcastd_avx512vl();
      auVar155 = ZEXT3264(auVar125);
      local_780 = (float)local_800._0_4_;
      fStack_77c = (float)local_800._0_4_;
      fStack_778 = (float)local_800._0_4_;
      fStack_774 = (float)local_800._0_4_;
      fStack_770 = (float)local_800._0_4_;
      fStack_76c = (float)local_800._0_4_;
      fStack_768 = (float)local_800._0_4_;
      fStack_764 = (float)local_800._0_4_;
      uStack_75c = local_760;
      uStack_758 = local_760;
      uStack_754 = local_760;
      uStack_750 = local_760;
      uStack_74c = local_760;
      uStack_748 = local_760;
      uStack_744 = local_760;
      local_420 = 1.0 / (float)local_7a0._0_4_;
      fStack_41c = local_420;
      fStack_418 = local_420;
      fStack_414 = local_420;
      fStack_410 = local_420;
      fStack_40c = local_420;
      fStack_408 = local_420;
      fStack_404 = local_420;
      lVar84 = 8;
LAB_019257a5:
      if (lVar84 < iVar7) {
        auVar125 = vpbroadcastd_avx512vl();
        auVar125 = vpor_avx2(auVar125,_DAT_01fb4ba0);
        uVar30 = vpcmpgtd_avx512vl(auVar155._0_32_,auVar125);
        auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar84 * 4 + lVar87);
        auVar127 = *(undefined1 (*) [32])(lVar87 + 0x21fb768 + lVar84 * 4);
        auVar131 = *(undefined1 (*) [32])(lVar87 + 0x21fbbec + lVar84 * 4);
        auVar129 = *(undefined1 (*) [32])(lVar87 + 0x21fc070 + lVar84 * 4);
        auVar219._0_4_ = auVar129._0_4_ * (float)local_6e0._0_4_;
        auVar219._4_4_ = auVar129._4_4_ * (float)local_6e0._4_4_;
        auVar219._8_4_ = auVar129._8_4_ * fStack_6d8;
        auVar219._12_4_ = auVar129._12_4_ * fStack_6d4;
        auVar219._16_4_ = auVar129._16_4_ * fStack_6d0;
        auVar219._20_4_ = auVar129._20_4_ * fStack_6cc;
        auVar219._28_36_ = auVar218._28_36_;
        auVar219._24_4_ = auVar129._24_4_ * fStack_6c8;
        auVar218._0_4_ = auVar129._0_4_ * (float)local_700._0_4_;
        auVar218._4_4_ = auVar129._4_4_ * (float)local_700._4_4_;
        auVar218._8_4_ = auVar129._8_4_ * fStack_6f8;
        auVar218._12_4_ = auVar129._12_4_ * fStack_6f4;
        auVar218._16_4_ = auVar129._16_4_ * fStack_6f0;
        auVar218._20_4_ = auVar129._20_4_ * fStack_6ec;
        auVar218._28_36_ = auVar212._28_36_;
        auVar218._24_4_ = auVar129._24_4_ * fStack_6e8;
        auVar128 = vmulps_avx512vl(local_400,auVar129);
        auVar115 = vfmadd231ps_avx512vl(auVar219._0_32_,auVar131,local_6a0);
        auVar116 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar131,local_6c0);
        auVar128 = vfmadd231ps_avx512vl(auVar128,auVar131,local_3e0);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar127,local_660);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar127,local_680);
        auVar130 = vfmadd231ps_avx512vl(auVar128,auVar127,local_3c0);
        auVar106 = vfmadd231ps_fma(auVar115,auVar125,local_620);
        auVar218 = ZEXT1664(auVar106);
        auVar109 = vfmadd231ps_fma(auVar116,auVar125,local_640);
        auVar212 = ZEXT1664(auVar109);
        auVar128 = *(undefined1 (*) [32])(bezier_basis1 + lVar84 * 4 + lVar87);
        auVar115 = *(undefined1 (*) [32])(lVar87 + 0x21fdb88 + lVar84 * 4);
        auVar118 = vfmadd231ps_avx512vl(auVar130,auVar125,local_3a0);
        auVar116 = *(undefined1 (*) [32])(lVar87 + 0x21fe00c + lVar84 * 4);
        auVar130 = *(undefined1 (*) [32])(lVar87 + 0x21fe490 + lVar84 * 4);
        auVar221._0_4_ = auVar130._0_4_ * (float)local_6e0._0_4_;
        auVar221._4_4_ = auVar130._4_4_ * (float)local_6e0._4_4_;
        auVar221._8_4_ = auVar130._8_4_ * fStack_6d8;
        auVar221._12_4_ = auVar130._12_4_ * fStack_6d4;
        auVar221._16_4_ = auVar130._16_4_ * fStack_6d0;
        auVar221._20_4_ = auVar130._20_4_ * fStack_6cc;
        auVar221._28_36_ = auVar220._28_36_;
        auVar221._24_4_ = auVar130._24_4_ * fStack_6c8;
        auVar45._4_4_ = auVar130._4_4_ * (float)local_700._4_4_;
        auVar45._0_4_ = auVar130._0_4_ * (float)local_700._0_4_;
        auVar45._8_4_ = auVar130._8_4_ * fStack_6f8;
        auVar45._12_4_ = auVar130._12_4_ * fStack_6f4;
        auVar45._16_4_ = auVar130._16_4_ * fStack_6f0;
        auVar45._20_4_ = auVar130._20_4_ * fStack_6ec;
        auVar45._24_4_ = auVar130._24_4_ * fStack_6e8;
        auVar45._28_4_ = uStack_6e4;
        auVar126 = vmulps_avx512vl(local_400,auVar130);
        auVar117 = vfmadd231ps_avx512vl(auVar221._0_32_,auVar116,local_6a0);
        auVar119 = vfmadd231ps_avx512vl(auVar45,auVar116,local_6c0);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar116,local_3e0);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar115,local_660);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar115,local_680);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar115,local_3c0);
        auVar108 = vfmadd231ps_fma(auVar117,auVar128,local_620);
        auVar220 = ZEXT1664(auVar108);
        auVar27 = vfmadd231ps_fma(auVar119,auVar128,local_640);
        auVar119 = vfmadd231ps_avx512vl(auVar126,auVar128,local_3a0);
        auVar120 = vmaxps_avx512vl(auVar118,auVar119);
        auVar126 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar106));
        auVar117 = vsubps_avx(ZEXT1632(auVar27),ZEXT1632(auVar109));
        auVar121 = vmulps_avx512vl(ZEXT1632(auVar109),auVar126);
        auVar122 = vmulps_avx512vl(ZEXT1632(auVar106),auVar117);
        auVar121 = vsubps_avx512vl(auVar121,auVar122);
        auVar122 = vmulps_avx512vl(auVar117,auVar117);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar126,auVar126);
        auVar120 = vmulps_avx512vl(auVar120,auVar120);
        auVar120 = vmulps_avx512vl(auVar120,auVar122);
        auVar121 = vmulps_avx512vl(auVar121,auVar121);
        uVar179 = vcmpps_avx512vl(auVar121,auVar120,2);
        bVar89 = (byte)uVar30 & (byte)uVar179;
        if (bVar89 != 0) {
          auVar130 = vmulps_avx512vl(local_4c0,auVar130);
          auVar116 = vfmadd213ps_avx512vl(auVar116,local_4a0,auVar130);
          auVar115 = vfmadd213ps_avx512vl(auVar115,local_480,auVar116);
          auVar128 = vfmadd213ps_avx512vl(auVar128,local_460,auVar115);
          auVar129 = vmulps_avx512vl(local_4c0,auVar129);
          auVar131 = vfmadd213ps_avx512vl(auVar131,local_4a0,auVar129);
          auVar127 = vfmadd213ps_avx512vl(auVar127,local_480,auVar131);
          auVar115 = vfmadd213ps_avx512vl(auVar125,local_460,auVar127);
          auVar125 = *(undefined1 (*) [32])(lVar87 + 0x21fc4f4 + lVar84 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar87 + 0x21fc978 + lVar84 * 4);
          auVar131 = *(undefined1 (*) [32])(lVar87 + 0x21fcdfc + lVar84 * 4);
          auVar129 = *(undefined1 (*) [32])(lVar87 + 0x21fd280 + lVar84 * 4);
          auVar116 = vmulps_avx512vl(_local_6e0,auVar129);
          auVar130 = vmulps_avx512vl(_local_700,auVar129);
          auVar129 = vmulps_avx512vl(local_4c0,auVar129);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar131,local_6a0);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar131,local_6c0);
          auVar131 = vfmadd231ps_avx512vl(auVar129,local_4a0,auVar131);
          auVar129 = vfmadd231ps_avx512vl(auVar116,auVar127,local_660);
          auVar116 = vfmadd231ps_avx512vl(auVar130,auVar127,local_680);
          auVar127 = vfmadd231ps_avx512vl(auVar131,local_480,auVar127);
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar125,local_620);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar125,local_640);
          auVar130 = vfmadd231ps_avx512vl(auVar127,local_460,auVar125);
          auVar125 = *(undefined1 (*) [32])(lVar87 + 0x21fe914 + lVar84 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar87 + 0x21ff21c + lVar84 * 4);
          auVar131 = *(undefined1 (*) [32])(lVar87 + 0x21ff6a0 + lVar84 * 4);
          auVar120 = vmulps_avx512vl(_local_6e0,auVar131);
          auVar121 = vmulps_avx512vl(_local_700,auVar131);
          auVar131 = vmulps_avx512vl(local_4c0,auVar131);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar127,local_6a0);
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar127,local_6c0);
          auVar131 = vfmadd231ps_avx512vl(auVar131,local_4a0,auVar127);
          auVar127 = *(undefined1 (*) [32])(lVar87 + 0x21fed98 + lVar84 * 4);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar127,local_660);
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar127,local_680);
          auVar127 = vfmadd231ps_avx512vl(auVar131,local_480,auVar127);
          auVar131 = vfmadd231ps_avx512vl(auVar120,auVar125,local_620);
          auVar120 = vfmadd231ps_avx512vl(auVar121,auVar125,local_640);
          auVar127 = vfmadd231ps_avx512vl(auVar127,local_460,auVar125);
          auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar129,auVar121);
          vandps_avx512vl(auVar116,auVar121);
          auVar125 = vmaxps_avx(auVar121,auVar121);
          vandps_avx512vl(auVar130,auVar121);
          auVar125 = vmaxps_avx(auVar125,auVar121);
          auVar77._4_4_ = fStack_77c;
          auVar77._0_4_ = local_780;
          auVar77._8_4_ = fStack_778;
          auVar77._12_4_ = fStack_774;
          auVar77._16_4_ = fStack_770;
          auVar77._20_4_ = fStack_76c;
          auVar77._24_4_ = fStack_768;
          auVar77._28_4_ = fStack_764;
          uVar81 = vcmpps_avx512vl(auVar125,auVar77,1);
          bVar13 = (bool)((byte)uVar81 & 1);
          auVar142._0_4_ = (float)((uint)bVar13 * auVar126._0_4_ | (uint)!bVar13 * auVar129._0_4_);
          bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar142._4_4_ = (float)((uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * auVar129._4_4_);
          bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar142._8_4_ = (float)((uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * auVar129._8_4_);
          bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar142._12_4_ =
               (float)((uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * auVar129._12_4_);
          bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar142._16_4_ =
               (float)((uint)bVar13 * auVar126._16_4_ | (uint)!bVar13 * auVar129._16_4_);
          bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar142._20_4_ =
               (float)((uint)bVar13 * auVar126._20_4_ | (uint)!bVar13 * auVar129._20_4_);
          bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar142._24_4_ =
               (float)((uint)bVar13 * auVar126._24_4_ | (uint)!bVar13 * auVar129._24_4_);
          bVar13 = SUB81(uVar81 >> 7,0);
          auVar142._28_4_ = (uint)bVar13 * auVar126._28_4_ | (uint)!bVar13 * auVar129._28_4_;
          bVar13 = (bool)((byte)uVar81 & 1);
          auVar143._0_4_ = (float)((uint)bVar13 * auVar117._0_4_ | (uint)!bVar13 * auVar116._0_4_);
          bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar143._4_4_ = (float)((uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar116._4_4_);
          bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar143._8_4_ = (float)((uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar116._8_4_);
          bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar143._12_4_ =
               (float)((uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar116._12_4_);
          bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar143._16_4_ =
               (float)((uint)bVar13 * auVar117._16_4_ | (uint)!bVar13 * auVar116._16_4_);
          bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar143._20_4_ =
               (float)((uint)bVar13 * auVar117._20_4_ | (uint)!bVar13 * auVar116._20_4_);
          bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar143._24_4_ =
               (float)((uint)bVar13 * auVar117._24_4_ | (uint)!bVar13 * auVar116._24_4_);
          bVar13 = SUB81(uVar81 >> 7,0);
          auVar143._28_4_ = (uint)bVar13 * auVar117._28_4_ | (uint)!bVar13 * auVar116._28_4_;
          vandps_avx512vl(auVar131,auVar121);
          vandps_avx512vl(auVar120,auVar121);
          auVar125 = vmaxps_avx(auVar143,auVar143);
          vandps_avx512vl(auVar127,auVar121);
          auVar125 = vmaxps_avx(auVar125,auVar143);
          uVar81 = vcmpps_avx512vl(auVar125,auVar77,1);
          bVar13 = (bool)((byte)uVar81 & 1);
          auVar144._0_4_ = (uint)bVar13 * auVar126._0_4_ | (uint)!bVar13 * auVar131._0_4_;
          bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * auVar131._4_4_;
          bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * auVar131._8_4_;
          bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * auVar131._12_4_;
          bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar144._16_4_ = (uint)bVar13 * auVar126._16_4_ | (uint)!bVar13 * auVar131._16_4_;
          bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar144._20_4_ = (uint)bVar13 * auVar126._20_4_ | (uint)!bVar13 * auVar131._20_4_;
          bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar144._24_4_ = (uint)bVar13 * auVar126._24_4_ | (uint)!bVar13 * auVar131._24_4_;
          bVar13 = SUB81(uVar81 >> 7,0);
          auVar144._28_4_ = (uint)bVar13 * auVar126._28_4_ | (uint)!bVar13 * auVar131._28_4_;
          bVar13 = (bool)((byte)uVar81 & 1);
          auVar145._0_4_ = (float)((uint)bVar13 * auVar117._0_4_ | (uint)!bVar13 * auVar120._0_4_);
          bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar145._4_4_ = (float)((uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar120._4_4_);
          bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar145._8_4_ = (float)((uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar120._8_4_);
          bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar145._12_4_ =
               (float)((uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar120._12_4_);
          bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar145._16_4_ =
               (float)((uint)bVar13 * auVar117._16_4_ | (uint)!bVar13 * auVar120._16_4_);
          bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar145._20_4_ =
               (float)((uint)bVar13 * auVar117._20_4_ | (uint)!bVar13 * auVar120._20_4_);
          bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar145._24_4_ =
               (float)((uint)bVar13 * auVar117._24_4_ | (uint)!bVar13 * auVar120._24_4_);
          bVar13 = SUB81(uVar81 >> 7,0);
          auVar145._28_4_ = (uint)bVar13 * auVar117._28_4_ | (uint)!bVar13 * auVar120._28_4_;
          auVar226._8_4_ = 0x80000000;
          auVar226._0_8_ = 0x8000000080000000;
          auVar226._12_4_ = 0x80000000;
          auVar226._16_4_ = 0x80000000;
          auVar226._20_4_ = 0x80000000;
          auVar226._24_4_ = 0x80000000;
          auVar226._28_4_ = 0x80000000;
          auVar125 = vxorps_avx512vl(auVar144,auVar226);
          auVar114 = vxorps_avx512vl(auVar121._0_16_,auVar121._0_16_);
          auVar127 = vfmadd213ps_avx512vl(auVar142,auVar142,ZEXT1632(auVar114));
          auVar102 = vfmadd231ps_fma(auVar127,auVar143,auVar143);
          auVar127 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
          auVar238._8_4_ = 0xbf000000;
          auVar238._0_8_ = 0xbf000000bf000000;
          auVar238._12_4_ = 0xbf000000;
          auVar238._16_4_ = 0xbf000000;
          auVar238._20_4_ = 0xbf000000;
          auVar238._24_4_ = 0xbf000000;
          auVar238._28_4_ = 0xbf000000;
          fVar184 = auVar127._0_4_;
          fVar222 = auVar127._4_4_;
          fVar224 = auVar127._8_4_;
          fVar178 = auVar127._12_4_;
          fVar193 = auVar127._16_4_;
          fVar183 = auVar127._20_4_;
          fVar192 = auVar127._24_4_;
          auVar46._4_4_ = fVar222 * fVar222 * fVar222 * auVar102._4_4_ * -0.5;
          auVar46._0_4_ = fVar184 * fVar184 * fVar184 * auVar102._0_4_ * -0.5;
          auVar46._8_4_ = fVar224 * fVar224 * fVar224 * auVar102._8_4_ * -0.5;
          auVar46._12_4_ = fVar178 * fVar178 * fVar178 * auVar102._12_4_ * -0.5;
          auVar46._16_4_ = fVar193 * fVar193 * fVar193 * -0.0;
          auVar46._20_4_ = fVar183 * fVar183 * fVar183 * -0.0;
          auVar46._24_4_ = fVar192 * fVar192 * fVar192 * -0.0;
          auVar46._28_4_ = auVar143._28_4_;
          auVar131 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar127 = vfmadd231ps_avx512vl(auVar46,auVar131,auVar127);
          auVar47._4_4_ = auVar143._4_4_ * auVar127._4_4_;
          auVar47._0_4_ = auVar143._0_4_ * auVar127._0_4_;
          auVar47._8_4_ = auVar143._8_4_ * auVar127._8_4_;
          auVar47._12_4_ = auVar143._12_4_ * auVar127._12_4_;
          auVar47._16_4_ = auVar143._16_4_ * auVar127._16_4_;
          auVar47._20_4_ = auVar143._20_4_ * auVar127._20_4_;
          auVar47._24_4_ = auVar143._24_4_ * auVar127._24_4_;
          auVar47._28_4_ = 0;
          auVar48._4_4_ = auVar127._4_4_ * -auVar142._4_4_;
          auVar48._0_4_ = auVar127._0_4_ * -auVar142._0_4_;
          auVar48._8_4_ = auVar127._8_4_ * -auVar142._8_4_;
          auVar48._12_4_ = auVar127._12_4_ * -auVar142._12_4_;
          auVar48._16_4_ = auVar127._16_4_ * -auVar142._16_4_;
          auVar48._20_4_ = auVar127._20_4_ * -auVar142._20_4_;
          auVar48._24_4_ = auVar127._24_4_ * -auVar142._24_4_;
          auVar48._28_4_ = auVar143._28_4_;
          auVar129 = vmulps_avx512vl(auVar127,ZEXT1632(auVar114));
          auVar130 = ZEXT1632(auVar114);
          auVar127 = vfmadd213ps_avx512vl(auVar144,auVar144,auVar130);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar145,auVar145);
          auVar116 = vrsqrt14ps_avx512vl(auVar127);
          auVar127 = vmulps_avx512vl(auVar127,auVar238);
          fVar184 = auVar116._0_4_;
          fVar222 = auVar116._4_4_;
          fVar224 = auVar116._8_4_;
          fVar178 = auVar116._12_4_;
          fVar193 = auVar116._16_4_;
          fVar183 = auVar116._20_4_;
          fVar192 = auVar116._24_4_;
          auVar49._4_4_ = fVar222 * fVar222 * fVar222 * auVar127._4_4_;
          auVar49._0_4_ = fVar184 * fVar184 * fVar184 * auVar127._0_4_;
          auVar49._8_4_ = fVar224 * fVar224 * fVar224 * auVar127._8_4_;
          auVar49._12_4_ = fVar178 * fVar178 * fVar178 * auVar127._12_4_;
          auVar49._16_4_ = fVar193 * fVar193 * fVar193 * auVar127._16_4_;
          auVar49._20_4_ = fVar183 * fVar183 * fVar183 * auVar127._20_4_;
          auVar49._24_4_ = fVar192 * fVar192 * fVar192 * auVar127._24_4_;
          auVar49._28_4_ = auVar127._28_4_;
          auVar127 = vfmadd231ps_avx512vl(auVar49,auVar131,auVar116);
          auVar50._4_4_ = auVar145._4_4_ * auVar127._4_4_;
          auVar50._0_4_ = auVar145._0_4_ * auVar127._0_4_;
          auVar50._8_4_ = auVar145._8_4_ * auVar127._8_4_;
          auVar50._12_4_ = auVar145._12_4_ * auVar127._12_4_;
          auVar50._16_4_ = auVar145._16_4_ * auVar127._16_4_;
          auVar50._20_4_ = auVar145._20_4_ * auVar127._20_4_;
          auVar50._24_4_ = auVar145._24_4_ * auVar127._24_4_;
          auVar50._28_4_ = auVar116._28_4_;
          auVar51._4_4_ = auVar127._4_4_ * auVar125._4_4_;
          auVar51._0_4_ = auVar127._0_4_ * auVar125._0_4_;
          auVar51._8_4_ = auVar127._8_4_ * auVar125._8_4_;
          auVar51._12_4_ = auVar127._12_4_ * auVar125._12_4_;
          auVar51._16_4_ = auVar127._16_4_ * auVar125._16_4_;
          auVar51._20_4_ = auVar127._20_4_ * auVar125._20_4_;
          auVar51._24_4_ = auVar127._24_4_ * auVar125._24_4_;
          auVar51._28_4_ = auVar125._28_4_;
          auVar125 = vmulps_avx512vl(auVar127,auVar130);
          auVar102 = vfmadd213ps_fma(auVar47,auVar118,ZEXT1632(auVar106));
          auVar98 = vfmadd213ps_fma(auVar48,auVar118,ZEXT1632(auVar109));
          auVar131 = vfmadd213ps_avx512vl(auVar129,auVar118,auVar115);
          auVar116 = vfmadd213ps_avx512vl(auVar50,auVar119,ZEXT1632(auVar108));
          auVar100 = vfnmadd213ps_fma(auVar47,auVar118,ZEXT1632(auVar106));
          auVar106 = vfmadd213ps_fma(auVar51,auVar119,ZEXT1632(auVar27));
          auVar101 = vfnmadd213ps_fma(auVar48,auVar118,ZEXT1632(auVar109));
          auVar109 = vfmadd213ps_fma(auVar125,auVar119,auVar128);
          auVar239 = vfnmadd231ps_fma(auVar115,auVar118,auVar129);
          auVar103 = vfnmadd213ps_fma(auVar50,auVar119,ZEXT1632(auVar108));
          auVar112 = vfnmadd213ps_fma(auVar51,auVar119,ZEXT1632(auVar27));
          auVar113 = vfnmadd231ps_fma(auVar128,auVar119,auVar125);
          auVar128 = vsubps_avx512vl(auVar116,ZEXT1632(auVar100));
          auVar125 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar101));
          auVar127 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar239));
          auVar52._4_4_ = auVar125._4_4_ * auVar239._4_4_;
          auVar52._0_4_ = auVar125._0_4_ * auVar239._0_4_;
          auVar52._8_4_ = auVar125._8_4_ * auVar239._8_4_;
          auVar52._12_4_ = auVar125._12_4_ * auVar239._12_4_;
          auVar52._16_4_ = auVar125._16_4_ * 0.0;
          auVar52._20_4_ = auVar125._20_4_ * 0.0;
          auVar52._24_4_ = auVar125._24_4_ * 0.0;
          auVar52._28_4_ = auVar129._28_4_;
          auVar108 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar101),auVar127);
          auVar53._4_4_ = auVar127._4_4_ * auVar100._4_4_;
          auVar53._0_4_ = auVar127._0_4_ * auVar100._0_4_;
          auVar53._8_4_ = auVar127._8_4_ * auVar100._8_4_;
          auVar53._12_4_ = auVar127._12_4_ * auVar100._12_4_;
          auVar53._16_4_ = auVar127._16_4_ * 0.0;
          auVar53._20_4_ = auVar127._20_4_ * 0.0;
          auVar53._24_4_ = auVar127._24_4_ * 0.0;
          auVar53._28_4_ = auVar127._28_4_;
          auVar27 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar239),auVar128);
          auVar54._4_4_ = auVar101._4_4_ * auVar128._4_4_;
          auVar54._0_4_ = auVar101._0_4_ * auVar128._0_4_;
          auVar54._8_4_ = auVar101._8_4_ * auVar128._8_4_;
          auVar54._12_4_ = auVar101._12_4_ * auVar128._12_4_;
          auVar54._16_4_ = auVar128._16_4_ * 0.0;
          auVar54._20_4_ = auVar128._20_4_ * 0.0;
          auVar54._24_4_ = auVar128._24_4_ * 0.0;
          auVar54._28_4_ = auVar128._28_4_;
          auVar99 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar100),auVar125);
          auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar130,ZEXT1632(auVar27));
          auVar125 = vfmadd231ps_avx512vl(auVar125,auVar130,ZEXT1632(auVar108));
          auVar121 = ZEXT1632(auVar114);
          uVar81 = vcmpps_avx512vl(auVar125,auVar121,2);
          bVar80 = (byte)uVar81;
          fVar156 = (float)((uint)(bVar80 & 1) * auVar102._0_4_ |
                           (uint)!(bool)(bVar80 & 1) * auVar103._0_4_);
          bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
          fVar158 = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar103._4_4_);
          bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
          fVar160 = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar103._8_4_);
          bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
          fVar162 = (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar103._12_4_);
          auVar130 = ZEXT1632(CONCAT412(fVar162,CONCAT48(fVar160,CONCAT44(fVar158,fVar156))));
          fVar157 = (float)((uint)(bVar80 & 1) * auVar98._0_4_ |
                           (uint)!(bool)(bVar80 & 1) * auVar112._0_4_);
          bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
          fVar159 = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar112._4_4_);
          bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
          fVar161 = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar112._8_4_);
          bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
          fVar163 = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar112._12_4_);
          auVar126 = ZEXT1632(CONCAT412(fVar163,CONCAT48(fVar161,CONCAT44(fVar159,fVar157))));
          auVar146._0_4_ =
               (float)((uint)(bVar80 & 1) * auVar131._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar113._0_4_);
          bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar146._4_4_ = (float)((uint)bVar13 * auVar131._4_4_ | (uint)!bVar13 * auVar113._4_4_);
          bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar146._8_4_ = (float)((uint)bVar13 * auVar131._8_4_ | (uint)!bVar13 * auVar113._8_4_);
          bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar146._12_4_ =
               (float)((uint)bVar13 * auVar131._12_4_ | (uint)!bVar13 * auVar113._12_4_);
          fVar184 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar131._16_4_);
          auVar146._16_4_ = fVar184;
          fVar222 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar131._20_4_);
          auVar146._20_4_ = fVar222;
          fVar224 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar131._24_4_);
          auVar146._24_4_ = fVar224;
          iVar1 = (uint)(byte)(uVar81 >> 7) * auVar131._28_4_;
          auVar146._28_4_ = iVar1;
          auVar125 = vblendmps_avx512vl(ZEXT1632(auVar100),auVar116);
          auVar147._0_4_ =
               (uint)(bVar80 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar108._0_4_;
          bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar147._4_4_ = (uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar108._4_4_;
          bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar147._8_4_ = (uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar108._8_4_;
          bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar147._12_4_ = (uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar108._12_4_;
          auVar147._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar125._16_4_;
          auVar147._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar125._20_4_;
          auVar147._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar125._24_4_;
          auVar147._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar125._28_4_;
          auVar125 = vblendmps_avx512vl(ZEXT1632(auVar101),ZEXT1632(auVar106));
          auVar148._0_4_ =
               (float)((uint)(bVar80 & 1) * auVar125._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar102._0_4_);
          bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar148._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar102._4_4_);
          bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar148._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar102._8_4_);
          bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar148._12_4_ =
               (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar102._12_4_);
          fVar183 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar125._16_4_);
          auVar148._16_4_ = fVar183;
          fVar193 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar125._20_4_);
          auVar148._20_4_ = fVar193;
          fVar178 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar125._24_4_);
          auVar148._24_4_ = fVar178;
          auVar148._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar125._28_4_;
          auVar125 = vblendmps_avx512vl(ZEXT1632(auVar239),ZEXT1632(auVar109));
          auVar149._0_4_ =
               (float)((uint)(bVar80 & 1) * auVar125._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar98._0_4_);
          bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar149._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar98._4_4_);
          bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar149._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar98._8_4_);
          bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar149._12_4_ = (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar98._12_4_)
          ;
          fVar192 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar125._16_4_);
          auVar149._16_4_ = fVar192;
          fVar91 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar125._20_4_);
          auVar149._20_4_ = fVar91;
          fVar92 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar125._24_4_);
          auVar149._24_4_ = fVar92;
          iVar2 = (uint)(byte)(uVar81 >> 7) * auVar125._28_4_;
          auVar149._28_4_ = iVar2;
          auVar150._0_4_ =
               (uint)(bVar80 & 1) * (int)auVar100._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar116._0_4_
          ;
          bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar150._4_4_ = (uint)bVar13 * (int)auVar100._4_4_ | (uint)!bVar13 * auVar116._4_4_;
          bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar150._8_4_ = (uint)bVar13 * (int)auVar100._8_4_ | (uint)!bVar13 * auVar116._8_4_;
          bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar150._12_4_ = (uint)bVar13 * (int)auVar100._12_4_ | (uint)!bVar13 * auVar116._12_4_;
          auVar150._16_4_ = (uint)!(bool)((byte)(uVar81 >> 4) & 1) * auVar116._16_4_;
          auVar150._20_4_ = (uint)!(bool)((byte)(uVar81 >> 5) & 1) * auVar116._20_4_;
          auVar150._24_4_ = (uint)!(bool)((byte)(uVar81 >> 6) & 1) * auVar116._24_4_;
          auVar150._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar116._28_4_;
          bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar81 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar81 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar116 = vsubps_avx512vl(auVar150,auVar130);
          auVar127 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar101._12_4_ |
                                                   (uint)!bVar17 * auVar106._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar101._8_4_ |
                                                            (uint)!bVar15 * auVar106._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar101._4_4_ |
                                                                     (uint)!bVar13 * auVar106._4_4_,
                                                                     (uint)(bVar80 & 1) *
                                                                     (int)auVar101._0_4_ |
                                                                     (uint)!(bool)(bVar80 & 1) *
                                                                     auVar106._0_4_)))),auVar126);
          auVar218 = ZEXT3264(auVar127);
          auVar131 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar239._12_4_ |
                                                   (uint)!bVar18 * auVar109._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar239._8_4_ |
                                                            (uint)!bVar16 * auVar109._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar239._4_4_ |
                                                                     (uint)!bVar14 * auVar109._4_4_,
                                                                     (uint)(bVar80 & 1) *
                                                                     (int)auVar239._0_4_ |
                                                                     (uint)!(bool)(bVar80 & 1) *
                                                                     auVar109._0_4_)))),auVar146);
          auVar129 = vsubps_avx(auVar130,auVar147);
          auVar220 = ZEXT3264(auVar129);
          auVar128 = vsubps_avx(auVar126,auVar148);
          auVar115 = vsubps_avx(auVar146,auVar149);
          auVar55._4_4_ = auVar131._4_4_ * fVar158;
          auVar55._0_4_ = auVar131._0_4_ * fVar156;
          auVar55._8_4_ = auVar131._8_4_ * fVar160;
          auVar55._12_4_ = auVar131._12_4_ * fVar162;
          auVar55._16_4_ = auVar131._16_4_ * 0.0;
          auVar55._20_4_ = auVar131._20_4_ * 0.0;
          auVar55._24_4_ = auVar131._24_4_ * 0.0;
          auVar55._28_4_ = 0;
          auVar106 = vfmsub231ps_fma(auVar55,auVar146,auVar116);
          auVar204._0_4_ = fVar157 * auVar116._0_4_;
          auVar204._4_4_ = fVar159 * auVar116._4_4_;
          auVar204._8_4_ = fVar161 * auVar116._8_4_;
          auVar204._12_4_ = fVar163 * auVar116._12_4_;
          auVar204._16_4_ = auVar116._16_4_ * 0.0;
          auVar204._20_4_ = auVar116._20_4_ * 0.0;
          auVar204._24_4_ = auVar116._24_4_ * 0.0;
          auVar204._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar204,auVar130,auVar127);
          auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar109),auVar121,ZEXT1632(auVar106));
          auVar210._0_4_ = auVar127._0_4_ * auVar146._0_4_;
          auVar210._4_4_ = auVar127._4_4_ * auVar146._4_4_;
          auVar210._8_4_ = auVar127._8_4_ * auVar146._8_4_;
          auVar210._12_4_ = auVar127._12_4_ * auVar146._12_4_;
          auVar210._16_4_ = auVar127._16_4_ * fVar184;
          auVar210._20_4_ = auVar127._20_4_ * fVar222;
          auVar210._24_4_ = auVar127._24_4_ * fVar224;
          auVar210._28_4_ = 0;
          auVar106 = vfmsub231ps_fma(auVar210,auVar126,auVar131);
          auVar117 = vfmadd231ps_avx512vl(auVar125,auVar121,ZEXT1632(auVar106));
          auVar125 = vmulps_avx512vl(auVar115,auVar147);
          auVar125 = vfmsub231ps_avx512vl(auVar125,auVar129,auVar149);
          auVar56._4_4_ = auVar128._4_4_ * auVar149._4_4_;
          auVar56._0_4_ = auVar128._0_4_ * auVar149._0_4_;
          auVar56._8_4_ = auVar128._8_4_ * auVar149._8_4_;
          auVar56._12_4_ = auVar128._12_4_ * auVar149._12_4_;
          auVar56._16_4_ = auVar128._16_4_ * fVar192;
          auVar56._20_4_ = auVar128._20_4_ * fVar91;
          auVar56._24_4_ = auVar128._24_4_ * fVar92;
          auVar56._28_4_ = iVar2;
          auVar106 = vfmsub231ps_fma(auVar56,auVar148,auVar115);
          auVar211._0_4_ = auVar148._0_4_ * auVar129._0_4_;
          auVar211._4_4_ = auVar148._4_4_ * auVar129._4_4_;
          auVar211._8_4_ = auVar148._8_4_ * auVar129._8_4_;
          auVar211._12_4_ = auVar148._12_4_ * auVar129._12_4_;
          auVar211._16_4_ = fVar183 * auVar129._16_4_;
          auVar211._20_4_ = fVar193 * auVar129._20_4_;
          auVar211._24_4_ = fVar178 * auVar129._24_4_;
          auVar211._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar211,auVar128,auVar147);
          auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar109),auVar121,auVar125);
          auVar120 = vfmadd231ps_avx512vl(auVar125,auVar121,ZEXT1632(auVar106));
          auVar212 = ZEXT3264(auVar120);
          auVar125 = vmaxps_avx(auVar117,auVar120);
          uVar179 = vcmpps_avx512vl(auVar125,auVar121,2);
          bVar89 = bVar89 & (byte)uVar179;
          if (bVar89 != 0) {
            auVar57._4_4_ = auVar115._4_4_ * auVar127._4_4_;
            auVar57._0_4_ = auVar115._0_4_ * auVar127._0_4_;
            auVar57._8_4_ = auVar115._8_4_ * auVar127._8_4_;
            auVar57._12_4_ = auVar115._12_4_ * auVar127._12_4_;
            auVar57._16_4_ = auVar115._16_4_ * auVar127._16_4_;
            auVar57._20_4_ = auVar115._20_4_ * auVar127._20_4_;
            auVar57._24_4_ = auVar115._24_4_ * auVar127._24_4_;
            auVar57._28_4_ = auVar125._28_4_;
            auVar27 = vfmsub231ps_fma(auVar57,auVar128,auVar131);
            auVar58._4_4_ = auVar131._4_4_ * auVar129._4_4_;
            auVar58._0_4_ = auVar131._0_4_ * auVar129._0_4_;
            auVar58._8_4_ = auVar131._8_4_ * auVar129._8_4_;
            auVar58._12_4_ = auVar131._12_4_ * auVar129._12_4_;
            auVar58._16_4_ = auVar131._16_4_ * auVar129._16_4_;
            auVar58._20_4_ = auVar131._20_4_ * auVar129._20_4_;
            auVar58._24_4_ = auVar131._24_4_ * auVar129._24_4_;
            auVar58._28_4_ = auVar131._28_4_;
            auVar108 = vfmsub231ps_fma(auVar58,auVar116,auVar115);
            auVar59._4_4_ = auVar128._4_4_ * auVar116._4_4_;
            auVar59._0_4_ = auVar128._0_4_ * auVar116._0_4_;
            auVar59._8_4_ = auVar128._8_4_ * auVar116._8_4_;
            auVar59._12_4_ = auVar128._12_4_ * auVar116._12_4_;
            auVar59._16_4_ = auVar128._16_4_ * auVar116._16_4_;
            auVar59._20_4_ = auVar128._20_4_ * auVar116._20_4_;
            auVar59._24_4_ = auVar128._24_4_ * auVar116._24_4_;
            auVar59._28_4_ = auVar128._28_4_;
            auVar102 = vfmsub231ps_fma(auVar59,auVar129,auVar127);
            auVar106 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar108),ZEXT1632(auVar102));
            auVar109 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar27),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar125 = vrcp14ps_avx512vl(ZEXT1632(auVar109));
            auVar36._8_4_ = 0x3f800000;
            auVar36._0_8_ = 0x3f8000003f800000;
            auVar36._12_4_ = 0x3f800000;
            auVar36._16_4_ = 0x3f800000;
            auVar36._20_4_ = 0x3f800000;
            auVar36._24_4_ = 0x3f800000;
            auVar36._28_4_ = 0x3f800000;
            auVar127 = vfnmadd213ps_avx512vl(auVar125,ZEXT1632(auVar109),auVar36);
            auVar106 = vfmadd132ps_fma(auVar127,auVar125,auVar125);
            auVar218 = ZEXT1664(auVar106);
            auVar60._4_4_ = auVar102._4_4_ * auVar146._4_4_;
            auVar60._0_4_ = auVar102._0_4_ * auVar146._0_4_;
            auVar60._8_4_ = auVar102._8_4_ * auVar146._8_4_;
            auVar60._12_4_ = auVar102._12_4_ * auVar146._12_4_;
            auVar60._16_4_ = fVar184 * 0.0;
            auVar60._20_4_ = fVar222 * 0.0;
            auVar60._24_4_ = fVar224 * 0.0;
            auVar60._28_4_ = iVar1;
            auVar108 = vfmadd231ps_fma(auVar60,auVar126,ZEXT1632(auVar108));
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar130,ZEXT1632(auVar27));
            fVar184 = auVar106._0_4_;
            fVar222 = auVar106._4_4_;
            fVar224 = auVar106._8_4_;
            fVar178 = auVar106._12_4_;
            local_5c0._28_4_ = auVar125._28_4_;
            local_5c0._0_28_ =
                 ZEXT1628(CONCAT412(auVar108._12_4_ * fVar178,
                                    CONCAT48(auVar108._8_4_ * fVar224,
                                             CONCAT44(auVar108._4_4_ * fVar222,
                                                      auVar108._0_4_ * fVar184))));
            auVar220 = ZEXT3264(local_5c0);
            auVar78._4_4_ = uStack_75c;
            auVar78._0_4_ = local_760;
            auVar78._8_4_ = uStack_758;
            auVar78._12_4_ = uStack_754;
            auVar78._16_4_ = uStack_750;
            auVar78._20_4_ = uStack_74c;
            auVar78._24_4_ = uStack_748;
            auVar78._28_4_ = uStack_744;
            uVar179 = vcmpps_avx512vl(local_5c0,auVar78,0xd);
            uVar177 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar37._4_4_ = uVar177;
            auVar37._0_4_ = uVar177;
            auVar37._8_4_ = uVar177;
            auVar37._12_4_ = uVar177;
            auVar37._16_4_ = uVar177;
            auVar37._20_4_ = uVar177;
            auVar37._24_4_ = uVar177;
            auVar37._28_4_ = uVar177;
            uVar30 = vcmpps_avx512vl(local_5c0,auVar37,2);
            bVar89 = (byte)uVar179 & (byte)uVar30 & bVar89;
            if (bVar89 != 0) {
              uVar90 = vcmpps_avx512vl(ZEXT1632(auVar109),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar90 = bVar89 & uVar90;
              if ((char)uVar90 != '\0') {
                fVar193 = auVar117._0_4_ * fVar184;
                fVar183 = auVar117._4_4_ * fVar222;
                auVar61._4_4_ = fVar183;
                auVar61._0_4_ = fVar193;
                fVar192 = auVar117._8_4_ * fVar224;
                auVar61._8_4_ = fVar192;
                fVar91 = auVar117._12_4_ * fVar178;
                auVar61._12_4_ = fVar91;
                fVar92 = auVar117._16_4_ * 0.0;
                auVar61._16_4_ = fVar92;
                fVar156 = auVar117._20_4_ * 0.0;
                auVar61._20_4_ = fVar156;
                fVar157 = auVar117._24_4_ * 0.0;
                auVar61._24_4_ = fVar157;
                auVar61._28_4_ = auVar117._28_4_;
                auVar191._8_4_ = 0x3f800000;
                auVar191._0_8_ = 0x3f8000003f800000;
                auVar191._12_4_ = 0x3f800000;
                auVar191._16_4_ = 0x3f800000;
                auVar191._20_4_ = 0x3f800000;
                auVar191._24_4_ = 0x3f800000;
                auVar191._28_4_ = 0x3f800000;
                auVar125 = vsubps_avx(auVar191,auVar61);
                local_600._0_4_ =
                     (float)((uint)(bVar80 & 1) * (int)fVar193 |
                            (uint)!(bool)(bVar80 & 1) * auVar125._0_4_);
                bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
                local_600._4_4_ =
                     (float)((uint)bVar13 * (int)fVar183 | (uint)!bVar13 * auVar125._4_4_);
                bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
                local_600._8_4_ =
                     (float)((uint)bVar13 * (int)fVar192 | (uint)!bVar13 * auVar125._8_4_);
                bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
                local_600._12_4_ =
                     (float)((uint)bVar13 * (int)fVar91 | (uint)!bVar13 * auVar125._12_4_);
                bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
                local_600._16_4_ =
                     (float)((uint)bVar13 * (int)fVar92 | (uint)!bVar13 * auVar125._16_4_);
                bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
                local_600._20_4_ =
                     (float)((uint)bVar13 * (int)fVar156 | (uint)!bVar13 * auVar125._20_4_);
                bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
                local_600._24_4_ =
                     (float)((uint)bVar13 * (int)fVar157 | (uint)!bVar13 * auVar125._24_4_);
                bVar13 = SUB81(uVar81 >> 7,0);
                local_600._28_4_ =
                     (float)((uint)bVar13 * auVar117._28_4_ | (uint)!bVar13 * auVar125._28_4_);
                auVar125 = vsubps_avx(auVar119,auVar118);
                auVar106 = vfmadd213ps_fma(auVar125,local_600,auVar118);
                uVar177 = *(undefined4 *)((long)local_7e0->ray_space + k * 4 + -0x40);
                auVar38._4_4_ = uVar177;
                auVar38._0_4_ = uVar177;
                auVar38._8_4_ = uVar177;
                auVar38._12_4_ = uVar177;
                auVar38._16_4_ = uVar177;
                auVar38._20_4_ = uVar177;
                auVar38._24_4_ = uVar177;
                auVar38._28_4_ = uVar177;
                auVar125 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar106._12_4_ + auVar106._12_4_,
                                                              CONCAT48(auVar106._8_4_ +
                                                                       auVar106._8_4_,
                                                                       CONCAT44(auVar106._4_4_ +
                                                                                auVar106._4_4_,
                                                                                auVar106._0_4_ +
                                                                                auVar106._0_4_)))),
                                           auVar38);
                uVar29 = vcmpps_avx512vl(local_5c0,auVar125,6);
                uVar90 = uVar90 & uVar29;
                bVar89 = (byte)uVar90;
                if (bVar89 != 0) {
                  auVar182._0_4_ = auVar120._0_4_ * fVar184;
                  auVar182._4_4_ = auVar120._4_4_ * fVar222;
                  auVar182._8_4_ = auVar120._8_4_ * fVar224;
                  auVar182._12_4_ = auVar120._12_4_ * fVar178;
                  auVar182._16_4_ = auVar120._16_4_ * 0.0;
                  auVar182._20_4_ = auVar120._20_4_ * 0.0;
                  auVar182._24_4_ = auVar120._24_4_ * 0.0;
                  auVar182._28_4_ = 0;
                  auVar205._8_4_ = 0x3f800000;
                  auVar205._0_8_ = 0x3f8000003f800000;
                  auVar205._12_4_ = 0x3f800000;
                  auVar205._16_4_ = 0x3f800000;
                  auVar205._20_4_ = 0x3f800000;
                  auVar205._24_4_ = 0x3f800000;
                  auVar205._28_4_ = 0x3f800000;
                  auVar125 = vsubps_avx(auVar205,auVar182);
                  auVar151._0_4_ =
                       (uint)(bVar80 & 1) * (int)auVar182._0_4_ |
                       (uint)!(bool)(bVar80 & 1) * auVar125._0_4_;
                  bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar151._4_4_ =
                       (uint)bVar13 * (int)auVar182._4_4_ | (uint)!bVar13 * auVar125._4_4_;
                  bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar151._8_4_ =
                       (uint)bVar13 * (int)auVar182._8_4_ | (uint)!bVar13 * auVar125._8_4_;
                  bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar151._12_4_ =
                       (uint)bVar13 * (int)auVar182._12_4_ | (uint)!bVar13 * auVar125._12_4_;
                  bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
                  auVar151._16_4_ =
                       (uint)bVar13 * (int)auVar182._16_4_ | (uint)!bVar13 * auVar125._16_4_;
                  bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
                  auVar151._20_4_ =
                       (uint)bVar13 * (int)auVar182._20_4_ | (uint)!bVar13 * auVar125._20_4_;
                  bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
                  auVar151._24_4_ =
                       (uint)bVar13 * (int)auVar182._24_4_ | (uint)!bVar13 * auVar125._24_4_;
                  auVar151._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar125._28_4_;
                  auVar39._8_4_ = 0x40000000;
                  auVar39._0_8_ = 0x4000000040000000;
                  auVar39._12_4_ = 0x40000000;
                  auVar39._16_4_ = 0x40000000;
                  auVar39._20_4_ = 0x40000000;
                  auVar39._24_4_ = 0x40000000;
                  auVar39._28_4_ = 0x40000000;
                  local_5e0 = vfmsub132ps_avx512vl(auVar151,auVar205,auVar39);
                  local_5a0 = (undefined4)lVar84;
                  local_590 = local_840;
                  uStack_588 = uStack_838;
                  local_580 = local_860;
                  uStack_578 = uStack_858;
                  local_570 = local_870;
                  uStack_568 = uStack_868;
                  local_560 = local_850;
                  uStack_558 = uStack_848;
                  pGVar86 = (context->scene->geometries).items[uVar6].ptr;
                  if ((pGVar86->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar106 = vcvtsi2ss_avx512f(auVar114,local_5a0);
                    fVar184 = auVar106._0_4_;
                    local_540[0] = (fVar184 + local_600._0_4_ + 0.0) * local_420;
                    local_540[1] = (fVar184 + local_600._4_4_ + 1.0) * fStack_41c;
                    local_540[2] = (fVar184 + local_600._8_4_ + 2.0) * fStack_418;
                    local_540[3] = (fVar184 + local_600._12_4_ + 3.0) * fStack_414;
                    fStack_530 = (fVar184 + local_600._16_4_ + 4.0) * fStack_410;
                    fStack_52c = (fVar184 + local_600._20_4_ + 5.0) * fStack_40c;
                    fStack_528 = (fVar184 + local_600._24_4_ + 6.0) * fStack_408;
                    fStack_524 = fVar184 + local_600._28_4_ + 7.0;
                    local_520 = local_5e0;
                    local_500 = local_5c0;
                    auVar171._8_4_ = 0x7f800000;
                    auVar171._0_8_ = 0x7f8000007f800000;
                    auVar171._12_4_ = 0x7f800000;
                    auVar171._16_4_ = 0x7f800000;
                    auVar171._20_4_ = 0x7f800000;
                    auVar171._24_4_ = 0x7f800000;
                    auVar171._28_4_ = 0x7f800000;
                    auVar125 = vblendmps_avx512vl(auVar171,local_5c0);
                    auVar152._0_4_ =
                         (uint)(bVar89 & 1) * auVar125._0_4_ |
                         (uint)!(bool)(bVar89 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
                    auVar152._4_4_ = (uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                    auVar152._8_4_ = (uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
                    auVar152._12_4_ = (uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                    auVar152._16_4_ = (uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar90 >> 5) & 1);
                    auVar152._20_4_ = (uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar90 >> 6) & 1);
                    auVar152._24_4_ = (uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar90 >> 7,0);
                    auVar152._28_4_ = (uint)bVar13 * auVar125._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar125 = vshufps_avx(auVar152,auVar152,0xb1);
                    auVar125 = vminps_avx(auVar152,auVar125);
                    auVar127 = vshufpd_avx(auVar125,auVar125,5);
                    auVar125 = vminps_avx(auVar125,auVar127);
                    auVar127 = vpermpd_avx2(auVar125,0x4e);
                    auVar125 = vminps_avx(auVar125,auVar127);
                    uVar179 = vcmpps_avx512vl(auVar152,auVar125,0);
                    uVar83 = (uint)uVar90;
                    if ((bVar89 & (byte)uVar179) != 0) {
                      uVar83 = (uint)(bVar89 & (byte)uVar179);
                    }
                    uVar82 = 0;
                    for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                      uVar82 = uVar82 + 1;
                    }
                    uVar81 = (ulong)uVar82;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar86->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_440 = vmovdqa64_avx512vl(auVar155._0_32_);
                      local_800 = ZEXT416(*(uint *)(ray + k * 4 + 0x200));
                      local_7c0._0_8_ = pGVar86;
                      local_7d8 = uVar85;
                      local_7a0 = local_5c0;
                      local_59c = iVar7;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_540[uVar81]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_520 + uVar81 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_500 + uVar81 * 4);
                        local_830.context = context->user;
                        fVar178 = local_200._0_4_;
                        fVar222 = 1.0 - fVar178;
                        fVar184 = fVar222 * fVar222 * -3.0;
                        auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * fVar222)),
                                                   ZEXT416((uint)(fVar178 * fVar222)),
                                                   ZEXT416(0xc0000000));
                        auVar109 = vfmsub132ss_fma(ZEXT416((uint)(fVar178 * fVar222)),
                                                   ZEXT416((uint)(fVar178 * fVar178)),
                                                   ZEXT416(0x40000000));
                        fVar222 = auVar106._0_4_ * 3.0;
                        fVar224 = auVar109._0_4_ * 3.0;
                        fVar178 = fVar178 * fVar178 * 3.0;
                        auVar216._0_4_ = fVar178 * fVar28;
                        auVar216._4_4_ = fVar178 * fVar62;
                        auVar216._8_4_ = fVar178 * fVar63;
                        auVar216._12_4_ = fVar178 * fVar79;
                        auVar164._4_4_ = fVar224;
                        auVar164._0_4_ = fVar224;
                        auVar164._8_4_ = fVar224;
                        auVar164._12_4_ = fVar224;
                        auVar106 = vfmadd132ps_fma(auVar164,auVar216,auVar105);
                        auVar201._4_4_ = fVar222;
                        auVar201._0_4_ = fVar222;
                        auVar201._8_4_ = fVar222;
                        auVar201._12_4_ = fVar222;
                        auVar106 = vfmadd132ps_fma(auVar201,auVar106,auVar104);
                        auVar165._4_4_ = fVar184;
                        auVar165._0_4_ = fVar184;
                        auVar165._8_4_ = fVar184;
                        auVar165._12_4_ = fVar184;
                        auVar106 = vfmadd132ps_fma(auVar165,auVar106,auVar107);
                        auVar176 = vbroadcastss_avx512f(auVar106);
                        auVar240 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar212 = vpermps_avx512f(auVar240,ZEXT1664(auVar106));
                        auVar218 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar218,ZEXT1664(auVar106));
                        local_2c0[0] = (RTCHitN)auVar176[0];
                        local_2c0[1] = (RTCHitN)auVar176[1];
                        local_2c0[2] = (RTCHitN)auVar176[2];
                        local_2c0[3] = (RTCHitN)auVar176[3];
                        local_2c0[4] = (RTCHitN)auVar176[4];
                        local_2c0[5] = (RTCHitN)auVar176[5];
                        local_2c0[6] = (RTCHitN)auVar176[6];
                        local_2c0[7] = (RTCHitN)auVar176[7];
                        local_2c0[8] = (RTCHitN)auVar176[8];
                        local_2c0[9] = (RTCHitN)auVar176[9];
                        local_2c0[10] = (RTCHitN)auVar176[10];
                        local_2c0[0xb] = (RTCHitN)auVar176[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar176[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar176[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar176[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar176[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar176[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar176[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar176[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar176[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar176[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar176[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar176[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar176[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar176[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar176[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar176[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar176[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar176[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar176[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar176[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar176[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar176[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar176[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar176[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar176[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar176[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar176[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar176[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar176[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar176[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar176[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar176[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar176[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar176[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar176[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar176[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar176[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar176[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar176[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar176[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar176[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar176[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar176[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar176[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar176[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar176[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar176[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar176[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar176[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar176[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar176[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar176[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar176[0x3f];
                        local_280 = auVar212;
                        local_180 = local_340._0_8_;
                        uStack_178 = local_340._8_8_;
                        uStack_170 = local_340._16_8_;
                        uStack_168 = local_340._24_8_;
                        uStack_160 = local_340._32_8_;
                        uStack_158 = local_340._40_8_;
                        uStack_150 = local_340._48_8_;
                        uStack_148 = local_340._56_8_;
                        auVar176 = vmovdqa64_avx512f(local_300);
                        local_140 = vmovdqa64_avx512f(auVar176);
                        auVar125 = vpcmpeqd_avx2(auVar176._0_32_,auVar176._0_32_);
                        local_7e8[3] = auVar125;
                        local_7e8[2] = auVar125;
                        local_7e8[1] = auVar125;
                        *local_7e8 = auVar125;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]))
                        ;
                        auVar176 = vmovdqa64_avx512f(local_380);
                        local_740 = vmovdqa64_avx512f(auVar176);
                        local_830.valid = (int *)local_740;
                        local_830.geometryUserPtr = pGVar86->userPtr;
                        local_830.hit = local_2c0;
                        local_830.N = 0x10;
                        local_830.ray = (RTCRayN *)ray;
                        if (pGVar86->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar212 = ZEXT1664(auVar212._0_16_);
                          auVar218 = ZEXT1664(auVar218._0_16_);
                          (*pGVar86->intersectionFilterN)(&local_830);
                          auVar220 = ZEXT3264(local_7a0);
                          auVar176 = vmovdqa64_avx512f(local_740);
                          pGVar86 = (Geometry *)local_7c0._0_8_;
                        }
                        uVar179 = vptestmd_avx512f(auVar176,auVar176);
                        if ((short)uVar179 == 0) {
LAB_01926378:
                          *(undefined4 *)(ray + k * 4 + 0x200) = local_800._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar86->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar212 = ZEXT1664(auVar212._0_16_);
                            auVar218 = ZEXT1664(auVar218._0_16_);
                            (*p_Var12)(&local_830);
                            auVar220 = ZEXT3264(local_7a0);
                            auVar176 = vmovdqa64_avx512f(local_740);
                            pGVar86 = (Geometry *)local_7c0._0_8_;
                          }
                          uVar85 = vptestmd_avx512f(auVar176,auVar176);
                          if ((short)uVar85 == 0) goto LAB_01926378;
                          iVar1 = *(int *)(local_830.hit + 4);
                          iVar2 = *(int *)(local_830.hit + 8);
                          iVar64 = *(int *)(local_830.hit + 0xc);
                          iVar65 = *(int *)(local_830.hit + 0x10);
                          iVar66 = *(int *)(local_830.hit + 0x14);
                          iVar67 = *(int *)(local_830.hit + 0x18);
                          iVar68 = *(int *)(local_830.hit + 0x1c);
                          iVar69 = *(int *)(local_830.hit + 0x20);
                          iVar70 = *(int *)(local_830.hit + 0x24);
                          iVar71 = *(int *)(local_830.hit + 0x28);
                          iVar72 = *(int *)(local_830.hit + 0x2c);
                          iVar73 = *(int *)(local_830.hit + 0x30);
                          iVar74 = *(int *)(local_830.hit + 0x34);
                          iVar75 = *(int *)(local_830.hit + 0x38);
                          iVar76 = *(int *)(local_830.hit + 0x3c);
                          bVar89 = (byte)uVar85;
                          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                          bVar80 = (byte)(uVar85 >> 8);
                          bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                          bVar26 = SUB81(uVar85 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x300) =
                               (uint)(bVar89 & 1) * *(int *)local_830.hit |
                               (uint)!(bool)(bVar89 & 1) * *(int *)(local_830.ray + 0x300);
                          *(uint *)(local_830.ray + 0x304) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x304);
                          *(uint *)(local_830.ray + 0x308) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x308);
                          *(uint *)(local_830.ray + 0x30c) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x30c);
                          *(uint *)(local_830.ray + 0x310) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x310);
                          *(uint *)(local_830.ray + 0x314) =
                               (uint)bVar17 * iVar66 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x314);
                          *(uint *)(local_830.ray + 0x318) =
                               (uint)bVar18 * iVar67 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x318);
                          *(uint *)(local_830.ray + 0x31c) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x31c);
                          *(uint *)(local_830.ray + 800) =
                               (uint)(bVar80 & 1) * iVar69 |
                               (uint)!(bool)(bVar80 & 1) * *(int *)(local_830.ray + 800);
                          *(uint *)(local_830.ray + 0x324) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x324);
                          *(uint *)(local_830.ray + 0x328) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x328);
                          *(uint *)(local_830.ray + 0x32c) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x32c);
                          *(uint *)(local_830.ray + 0x330) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x330);
                          *(uint *)(local_830.ray + 0x334) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x334);
                          *(uint *)(local_830.ray + 0x338) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x338);
                          *(uint *)(local_830.ray + 0x33c) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x33c);
                          iVar1 = *(int *)(local_830.hit + 0x44);
                          iVar2 = *(int *)(local_830.hit + 0x48);
                          iVar64 = *(int *)(local_830.hit + 0x4c);
                          iVar65 = *(int *)(local_830.hit + 0x50);
                          iVar66 = *(int *)(local_830.hit + 0x54);
                          iVar67 = *(int *)(local_830.hit + 0x58);
                          iVar68 = *(int *)(local_830.hit + 0x5c);
                          iVar69 = *(int *)(local_830.hit + 0x60);
                          iVar70 = *(int *)(local_830.hit + 100);
                          iVar71 = *(int *)(local_830.hit + 0x68);
                          iVar72 = *(int *)(local_830.hit + 0x6c);
                          iVar73 = *(int *)(local_830.hit + 0x70);
                          iVar74 = *(int *)(local_830.hit + 0x74);
                          iVar75 = *(int *)(local_830.hit + 0x78);
                          iVar76 = *(int *)(local_830.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                          bVar26 = SUB81(uVar85 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x340) =
                               (uint)(bVar89 & 1) * *(int *)(local_830.hit + 0x40) |
                               (uint)!(bool)(bVar89 & 1) * *(int *)(local_830.ray + 0x340);
                          *(uint *)(local_830.ray + 0x344) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x344);
                          *(uint *)(local_830.ray + 0x348) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x348);
                          *(uint *)(local_830.ray + 0x34c) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x34c);
                          *(uint *)(local_830.ray + 0x350) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x350);
                          *(uint *)(local_830.ray + 0x354) =
                               (uint)bVar17 * iVar66 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x354);
                          *(uint *)(local_830.ray + 0x358) =
                               (uint)bVar18 * iVar67 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x358);
                          *(uint *)(local_830.ray + 0x35c) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x35c);
                          *(uint *)(local_830.ray + 0x360) =
                               (uint)(bVar80 & 1) * iVar69 |
                               (uint)!(bool)(bVar80 & 1) * *(int *)(local_830.ray + 0x360);
                          *(uint *)(local_830.ray + 0x364) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x364);
                          *(uint *)(local_830.ray + 0x368) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x368);
                          *(uint *)(local_830.ray + 0x36c) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x36c);
                          *(uint *)(local_830.ray + 0x370) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x370);
                          *(uint *)(local_830.ray + 0x374) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x374);
                          *(uint *)(local_830.ray + 0x378) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x378);
                          *(uint *)(local_830.ray + 0x37c) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x37c);
                          iVar1 = *(int *)(local_830.hit + 0x84);
                          iVar2 = *(int *)(local_830.hit + 0x88);
                          iVar64 = *(int *)(local_830.hit + 0x8c);
                          iVar65 = *(int *)(local_830.hit + 0x90);
                          iVar66 = *(int *)(local_830.hit + 0x94);
                          iVar67 = *(int *)(local_830.hit + 0x98);
                          iVar68 = *(int *)(local_830.hit + 0x9c);
                          iVar69 = *(int *)(local_830.hit + 0xa0);
                          iVar70 = *(int *)(local_830.hit + 0xa4);
                          iVar71 = *(int *)(local_830.hit + 0xa8);
                          iVar72 = *(int *)(local_830.hit + 0xac);
                          iVar73 = *(int *)(local_830.hit + 0xb0);
                          iVar74 = *(int *)(local_830.hit + 0xb4);
                          iVar75 = *(int *)(local_830.hit + 0xb8);
                          iVar76 = *(int *)(local_830.hit + 0xbc);
                          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                          bVar26 = SUB81(uVar85 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x380) =
                               (uint)(bVar89 & 1) * *(int *)(local_830.hit + 0x80) |
                               (uint)!(bool)(bVar89 & 1) * *(int *)(local_830.ray + 0x380);
                          *(uint *)(local_830.ray + 900) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_830.ray + 900);
                          *(uint *)(local_830.ray + 0x388) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x388);
                          *(uint *)(local_830.ray + 0x38c) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x38c);
                          *(uint *)(local_830.ray + 0x390) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x390);
                          *(uint *)(local_830.ray + 0x394) =
                               (uint)bVar17 * iVar66 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x394);
                          *(uint *)(local_830.ray + 0x398) =
                               (uint)bVar18 * iVar67 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x398);
                          *(uint *)(local_830.ray + 0x39c) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x39c);
                          *(uint *)(local_830.ray + 0x3a0) =
                               (uint)(bVar80 & 1) * iVar69 |
                               (uint)!(bool)(bVar80 & 1) * *(int *)(local_830.ray + 0x3a0);
                          *(uint *)(local_830.ray + 0x3a4) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x3a4);
                          *(uint *)(local_830.ray + 0x3a8) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x3a8);
                          *(uint *)(local_830.ray + 0x3ac) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x3ac);
                          *(uint *)(local_830.ray + 0x3b0) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x3b0);
                          *(uint *)(local_830.ray + 0x3b4) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x3b4);
                          *(uint *)(local_830.ray + 0x3b8) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x3b8);
                          *(uint *)(local_830.ray + 0x3bc) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x3bc);
                          iVar1 = *(int *)(local_830.hit + 0xc4);
                          iVar2 = *(int *)(local_830.hit + 200);
                          iVar64 = *(int *)(local_830.hit + 0xcc);
                          iVar65 = *(int *)(local_830.hit + 0xd0);
                          iVar66 = *(int *)(local_830.hit + 0xd4);
                          iVar67 = *(int *)(local_830.hit + 0xd8);
                          iVar68 = *(int *)(local_830.hit + 0xdc);
                          iVar69 = *(int *)(local_830.hit + 0xe0);
                          iVar70 = *(int *)(local_830.hit + 0xe4);
                          iVar71 = *(int *)(local_830.hit + 0xe8);
                          iVar72 = *(int *)(local_830.hit + 0xec);
                          iVar73 = *(int *)(local_830.hit + 0xf0);
                          iVar74 = *(int *)(local_830.hit + 0xf4);
                          iVar75 = *(int *)(local_830.hit + 0xf8);
                          iVar76 = *(int *)(local_830.hit + 0xfc);
                          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                          bVar26 = SUB81(uVar85 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x3c0) =
                               (uint)(bVar89 & 1) * *(int *)(local_830.hit + 0xc0) |
                               (uint)!(bool)(bVar89 & 1) * *(int *)(local_830.ray + 0x3c0);
                          *(uint *)(local_830.ray + 0x3c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x3c4);
                          *(uint *)(local_830.ray + 0x3c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x3c8);
                          *(uint *)(local_830.ray + 0x3cc) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x3cc);
                          *(uint *)(local_830.ray + 0x3d0) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x3d0);
                          *(uint *)(local_830.ray + 0x3d4) =
                               (uint)bVar17 * iVar66 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x3d4);
                          *(uint *)(local_830.ray + 0x3d8) =
                               (uint)bVar18 * iVar67 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x3d8);
                          *(uint *)(local_830.ray + 0x3dc) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x3dc);
                          *(uint *)(local_830.ray + 0x3e0) =
                               (uint)(bVar80 & 1) * iVar69 |
                               (uint)!(bool)(bVar80 & 1) * *(int *)(local_830.ray + 0x3e0);
                          *(uint *)(local_830.ray + 0x3e4) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x3e4);
                          *(uint *)(local_830.ray + 1000) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 1000);
                          *(uint *)(local_830.ray + 0x3ec) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x3ec);
                          *(uint *)(local_830.ray + 0x3f0) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x3f0);
                          *(uint *)(local_830.ray + 0x3f4) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x3f4);
                          *(uint *)(local_830.ray + 0x3f8) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x3f8);
                          *(uint *)(local_830.ray + 0x3fc) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x3fc);
                          iVar1 = *(int *)(local_830.hit + 0x104);
                          iVar2 = *(int *)(local_830.hit + 0x108);
                          iVar64 = *(int *)(local_830.hit + 0x10c);
                          iVar65 = *(int *)(local_830.hit + 0x110);
                          iVar66 = *(int *)(local_830.hit + 0x114);
                          iVar67 = *(int *)(local_830.hit + 0x118);
                          iVar68 = *(int *)(local_830.hit + 0x11c);
                          iVar69 = *(int *)(local_830.hit + 0x120);
                          iVar70 = *(int *)(local_830.hit + 0x124);
                          iVar71 = *(int *)(local_830.hit + 0x128);
                          iVar72 = *(int *)(local_830.hit + 300);
                          iVar73 = *(int *)(local_830.hit + 0x130);
                          iVar74 = *(int *)(local_830.hit + 0x134);
                          iVar75 = *(int *)(local_830.hit + 0x138);
                          iVar76 = *(int *)(local_830.hit + 0x13c);
                          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                          bVar26 = SUB81(uVar85 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x400) =
                               (uint)(bVar89 & 1) * *(int *)(local_830.hit + 0x100) |
                               (uint)!(bool)(bVar89 & 1) * *(int *)(local_830.ray + 0x400);
                          *(uint *)(local_830.ray + 0x404) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x404);
                          *(uint *)(local_830.ray + 0x408) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x408);
                          *(uint *)(local_830.ray + 0x40c) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x40c);
                          *(uint *)(local_830.ray + 0x410) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x410);
                          *(uint *)(local_830.ray + 0x414) =
                               (uint)bVar17 * iVar66 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x414);
                          *(uint *)(local_830.ray + 0x418) =
                               (uint)bVar18 * iVar67 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x418);
                          *(uint *)(local_830.ray + 0x41c) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x41c);
                          *(uint *)(local_830.ray + 0x420) =
                               (uint)(bVar80 & 1) * iVar69 |
                               (uint)!(bool)(bVar80 & 1) * *(int *)(local_830.ray + 0x420);
                          *(uint *)(local_830.ray + 0x424) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x424);
                          *(uint *)(local_830.ray + 0x428) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x428);
                          *(uint *)(local_830.ray + 0x42c) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x42c);
                          *(uint *)(local_830.ray + 0x430) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x430);
                          *(uint *)(local_830.ray + 0x434) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x434);
                          *(uint *)(local_830.ray + 0x438) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x438);
                          *(uint *)(local_830.ray + 0x43c) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x43c);
                          auVar176 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140)
                                                      );
                          auVar176 = vmovdqu32_avx512f(auVar176);
                          *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar176;
                          auVar176 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180)
                                                      );
                          auVar176 = vmovdqu32_avx512f(auVar176);
                          *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar176;
                          auVar176 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0)
                                                      );
                          auVar176 = vmovdqa32_avx512f(auVar176);
                          *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar176;
                          auVar176 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200)
                                                      );
                          auVar176 = vmovdqa32_avx512f(auVar176);
                          *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar176;
                          local_800._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                          local_800._4_4_ = 0;
                          local_800._8_4_ = 0;
                          local_800._12_4_ = 0;
                        }
                        bVar89 = ~(byte)(1 << ((uint)uVar81 & 0x1f)) & (byte)uVar90;
                        auVar172._4_4_ = local_800._0_4_;
                        auVar172._0_4_ = local_800._0_4_;
                        auVar172._8_4_ = local_800._0_4_;
                        auVar172._12_4_ = local_800._0_4_;
                        auVar172._16_4_ = local_800._0_4_;
                        auVar172._20_4_ = local_800._0_4_;
                        auVar172._24_4_ = local_800._0_4_;
                        auVar172._28_4_ = local_800._0_4_;
                        uVar179 = vcmpps_avx512vl(auVar220._0_32_,auVar172,2);
                        if ((bVar89 & (byte)uVar179) == 0) goto LAB_0192641e;
                        bVar89 = bVar89 & (byte)uVar179;
                        auVar173._8_4_ = 0x7f800000;
                        auVar173._0_8_ = 0x7f8000007f800000;
                        auVar173._12_4_ = 0x7f800000;
                        auVar173._16_4_ = 0x7f800000;
                        auVar173._20_4_ = 0x7f800000;
                        auVar173._24_4_ = 0x7f800000;
                        auVar173._28_4_ = 0x7f800000;
                        auVar125 = vblendmps_avx512vl(auVar173,auVar220._0_32_);
                        auVar153._0_4_ =
                             (uint)(bVar89 & 1) * auVar125._0_4_ |
                             (uint)!(bool)(bVar89 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar89 >> 1 & 1);
                        auVar153._4_4_ = (uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar89 >> 2 & 1);
                        auVar153._8_4_ = (uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar89 >> 3 & 1);
                        auVar153._12_4_ =
                             (uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar89 >> 4 & 1);
                        auVar153._16_4_ =
                             (uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar89 >> 5 & 1);
                        auVar153._20_4_ =
                             (uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar89 >> 6 & 1);
                        auVar153._24_4_ =
                             (uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar153._28_4_ =
                             (uint)(bVar89 >> 7) * auVar125._28_4_ |
                             (uint)!(bool)(bVar89 >> 7) * 0x7f800000;
                        auVar125 = vshufps_avx(auVar153,auVar153,0xb1);
                        auVar125 = vminps_avx(auVar153,auVar125);
                        auVar127 = vshufpd_avx(auVar125,auVar125,5);
                        auVar125 = vminps_avx(auVar125,auVar127);
                        auVar127 = vpermpd_avx2(auVar125,0x4e);
                        auVar125 = vminps_avx(auVar125,auVar127);
                        uVar179 = vcmpps_avx512vl(auVar153,auVar125,0);
                        bVar80 = (byte)uVar179 & bVar89;
                        uVar90 = (ulong)bVar89;
                        if (bVar80 != 0) {
                          bVar89 = bVar80;
                        }
                        uVar83 = 0;
                        for (uVar82 = (uint)bVar89; (uVar82 & 1) == 0;
                            uVar82 = uVar82 >> 1 | 0x80000000) {
                          uVar83 = uVar83 + 1;
                        }
                        uVar81 = (ulong)uVar83;
                      } while( true );
                    }
                    fVar184 = local_540[uVar81];
                    uVar177 = *(undefined4 *)(local_520 + uVar81 * 4);
                    fVar224 = 1.0 - fVar184;
                    fVar222 = fVar224 * fVar224 * -3.0;
                    auVar212 = ZEXT464((uint)fVar222);
                    auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * fVar224)),
                                               ZEXT416((uint)(fVar184 * fVar224)),
                                               ZEXT416(0xc0000000));
                    auVar109 = vfmsub132ss_fma(ZEXT416((uint)(fVar184 * fVar224)),
                                               ZEXT416((uint)(fVar184 * fVar184)),
                                               ZEXT416(0x40000000));
                    fVar224 = auVar106._0_4_ * 3.0;
                    fVar178 = auVar109._0_4_ * 3.0;
                    fVar193 = fVar184 * fVar184 * 3.0;
                    auVar215._0_4_ = fVar193 * fVar28;
                    auVar215._4_4_ = fVar193 * fVar62;
                    auVar215._8_4_ = fVar193 * fVar63;
                    auVar215._12_4_ = fVar193 * fVar79;
                    auVar218 = ZEXT1664(auVar215);
                    auVar188._4_4_ = fVar178;
                    auVar188._0_4_ = fVar178;
                    auVar188._8_4_ = fVar178;
                    auVar188._12_4_ = fVar178;
                    auVar106 = vfmadd132ps_fma(auVar188,auVar215,auVar105);
                    auVar200._4_4_ = fVar224;
                    auVar200._0_4_ = fVar224;
                    auVar200._8_4_ = fVar224;
                    auVar200._12_4_ = fVar224;
                    auVar106 = vfmadd132ps_fma(auVar200,auVar106,auVar104);
                    auVar189._4_4_ = fVar222;
                    auVar189._0_4_ = fVar222;
                    auVar189._8_4_ = fVar222;
                    auVar189._12_4_ = fVar222;
                    auVar106 = vfmadd132ps_fma(auVar189,auVar106,auVar107);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_500 + uVar81 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar106._0_4_;
                    uVar8 = vextractps_avx(auVar106,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar8;
                    uVar8 = vextractps_avx(auVar106,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar8;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar184;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar177;
                    *(int *)(ray + k * 4 + 0x440) = (int)uVar85;
                    *(uint *)(ray + k * 4 + 0x480) = uVar6;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_0192604d;
      }
    }
    uVar177 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar32._4_4_ = uVar177;
    auVar32._0_4_ = uVar177;
    auVar32._8_4_ = uVar177;
    auVar32._12_4_ = uVar177;
    uVar179 = vcmpps_avx512vl(local_4d0,auVar32,2);
    local_7c8 = (ulong)((uint)local_7c8 & (uint)local_7c8 + 0xf & (uint)uVar179);
  } while( true );
LAB_0192641e:
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar240 = ZEXT1664(auVar106);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar176 = ZEXT1664(auVar106);
  auVar125 = vmovdqa64_avx512vl(local_440);
  auVar155 = ZEXT3264(auVar125);
  uVar85 = local_7d8;
LAB_0192604d:
  lVar84 = lVar84 + 8;
  goto LAB_019257a5;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }